

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_1,_true,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::QuadMvIntersectorKPluecker<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  Geometry *pGVar1;
  RTCRayQueryContext *pRVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [32];
  ulong uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ulong uVar25;
  size_t k;
  bool bVar26;
  long lVar27;
  undefined1 (*pauVar28) [64];
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  ulong *puVar34;
  NodeRef root;
  long lVar35;
  ushort uVar36;
  undefined4 uVar37;
  ulong uVar38;
  int iVar39;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  int iVar86;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar87 [64];
  undefined1 in_ZMM2 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  vfloat<16> t;
  vfloat<16> v;
  vfloat<16> u;
  Vec3vf<16> Ng;
  TravRayK<16,_true> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a97c;
  Precalculations local_a951;
  RayK<16> *local_a950;
  uint local_a948;
  undefined4 local_a944;
  Geometry *local_a940;
  undefined1 (*local_a938) [32];
  RTCFilterFunctionNArguments local_a930;
  undefined1 local_a900 [16];
  _Head_base<1UL,_embree::vfloat_impl<16>_&,_false> _Stack_a8f0;
  _Head_base<0UL,_embree::vfloat_impl<16>_&,_false> _Stack_a8e8;
  undefined1 auStack_a8e0 [32];
  BVH *local_a8a8;
  Intersectors *local_a8a0;
  long local_a898;
  long local_a890;
  long local_a888;
  undefined1 local_a880 [64];
  undefined8 local_a810;
  undefined8 uStack_a808;
  undefined1 local_a800 [64];
  undefined1 local_a7c0 [64];
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  undefined1 local_a700 [64];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a6c0;
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  undefined1 local_a4c0 [64];
  undefined1 local_a480 [192];
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a3c0;
  undefined1 local_a300 [64];
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  undefined1 local_a1c0 [64];
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  uint local_a0c0;
  uint uStack_a0bc;
  uint uStack_a0b8;
  uint uStack_a0b4;
  uint uStack_a0b0;
  uint uStack_a0ac;
  uint uStack_a0a8;
  uint uStack_a0a4;
  uint uStack_a0a0;
  uint uStack_a09c;
  uint uStack_a098;
  uint uStack_a094;
  uint uStack_a090;
  uint uStack_a08c;
  uint uStack_a088;
  uint uStack_a084;
  uint local_a080;
  uint uStack_a07c;
  uint uStack_a078;
  uint uStack_a074;
  uint uStack_a070;
  uint uStack_a06c;
  uint uStack_a068;
  uint uStack_a064;
  uint uStack_a060;
  uint uStack_a05c;
  uint uStack_a058;
  uint uStack_a054;
  uint uStack_a050;
  uint uStack_a04c;
  uint uStack_a048;
  uint uStack_a044;
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  undefined1 local_9fc0 [64];
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  undefined1 local_9f00 [64];
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a8a8 = (BVH *)This->ptr;
  local_9e48 = (local_a8a8->root).ptr;
  if (local_9e48 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar40 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
      auVar87 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar38 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar87,5);
      uVar25 = vpcmpeqd_avx512f(auVar40,(undefined1  [64])valid_i->field_0);
      uVar38 = uVar38 & uVar25;
      if ((ushort)uVar38 != 0) {
        local_a3c0._0_8_ = *(undefined8 *)ray;
        local_a3c0._8_8_ = *(undefined8 *)(ray + 8);
        local_a3c0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_a3c0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_a3c0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_a3c0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_a3c0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_a3c0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_a3c0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_a3c0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_a3c0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_a3c0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_a3c0._96_8_ = *(undefined8 *)(ray + 0x60);
        local_a3c0._104_8_ = *(undefined8 *)(ray + 0x68);
        local_a3c0._112_8_ = *(undefined8 *)(ray + 0x70);
        local_a3c0._120_8_ = *(undefined8 *)(ray + 0x78);
        local_a3c0._128_8_ = *(undefined8 *)(ray + 0x80);
        local_a3c0._136_8_ = *(undefined8 *)(ray + 0x88);
        local_a3c0._144_8_ = *(undefined8 *)(ray + 0x90);
        local_a3c0._152_8_ = *(undefined8 *)(ray + 0x98);
        local_a3c0._160_8_ = *(undefined8 *)(ray + 0xa0);
        local_a3c0._168_8_ = *(undefined8 *)(ray + 0xa8);
        local_a3c0._176_8_ = *(undefined8 *)(ray + 0xb0);
        local_a3c0._184_8_ = *(undefined8 *)(ray + 0xb8);
        local_a300 = *(undefined1 (*) [64])(ray + 0x100);
        local_a2c0 = *(undefined1 (*) [64])(ray + 0x140);
        local_a280 = *(undefined1 (*) [64])(ray + 0x180);
        auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
        auVar41 = vandps_avx512dq(local_a300,auVar40);
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
        uVar25 = vcmpps_avx512f(auVar41,auVar42,1);
        auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar43 = vdivps_avx512f(auVar41,local_a300);
        auVar44 = vdivps_avx512f(auVar41,local_a2c0);
        auVar45 = vandps_avx512dq(local_a2c0,auVar40);
        uVar21 = vcmpps_avx512f(auVar45,auVar42,1);
        auVar45 = vandps_avx512dq(local_a280,auVar40);
        auVar46 = vdivps_avx512f(auVar41,local_a280);
        uVar30 = vcmpps_avx512f(auVar45,auVar42,1);
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x5d5e0b6b));
        bVar26 = (bool)((byte)uVar25 & 1);
        iVar39 = auVar42._0_4_;
        local_a240._0_4_ = (uint)bVar26 * iVar39 | (uint)!bVar26 * auVar43._0_4_;
        bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
        iVar72 = auVar42._4_4_;
        local_a240._4_4_ = (uint)bVar26 * iVar72 | (uint)!bVar26 * auVar43._4_4_;
        bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
        iVar73 = auVar42._8_4_;
        local_a240._8_4_ = (uint)bVar26 * iVar73 | (uint)!bVar26 * auVar43._8_4_;
        bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
        iVar74 = auVar42._12_4_;
        local_a240._12_4_ = (uint)bVar26 * iVar74 | (uint)!bVar26 * auVar43._12_4_;
        bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
        iVar75 = auVar42._16_4_;
        local_a240._16_4_ = (uint)bVar26 * iVar75 | (uint)!bVar26 * auVar43._16_4_;
        bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
        iVar76 = auVar42._20_4_;
        local_a240._20_4_ = (uint)bVar26 * iVar76 | (uint)!bVar26 * auVar43._20_4_;
        bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
        iVar77 = auVar42._24_4_;
        local_a240._24_4_ = (uint)bVar26 * iVar77 | (uint)!bVar26 * auVar43._24_4_;
        bVar26 = (bool)((byte)(uVar25 >> 7) & 1);
        iVar78 = auVar42._28_4_;
        local_a240._28_4_ = (uint)bVar26 * iVar78 | (uint)!bVar26 * auVar43._28_4_;
        bVar26 = (bool)((byte)(uVar25 >> 8) & 1);
        iVar79 = auVar42._32_4_;
        local_a240._32_4_ = (uint)bVar26 * iVar79 | (uint)!bVar26 * auVar43._32_4_;
        bVar26 = (bool)((byte)(uVar25 >> 9) & 1);
        iVar80 = auVar42._36_4_;
        local_a240._36_4_ = (uint)bVar26 * iVar80 | (uint)!bVar26 * auVar43._36_4_;
        bVar26 = (bool)((byte)(uVar25 >> 10) & 1);
        iVar81 = auVar42._40_4_;
        local_a240._40_4_ = (uint)bVar26 * iVar81 | (uint)!bVar26 * auVar43._40_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xb) & 1);
        iVar82 = auVar42._44_4_;
        local_a240._44_4_ = (uint)bVar26 * iVar82 | (uint)!bVar26 * auVar43._44_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xc) & 1);
        iVar83 = auVar42._48_4_;
        local_a240._48_4_ = (uint)bVar26 * iVar83 | (uint)!bVar26 * auVar43._48_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xd) & 1);
        iVar84 = auVar42._52_4_;
        local_a240._52_4_ = (uint)bVar26 * iVar84 | (uint)!bVar26 * auVar43._52_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xe) & 1);
        iVar85 = auVar42._56_4_;
        iVar86 = auVar42._60_4_;
        local_a240._56_4_ = (uint)bVar26 * iVar85 | (uint)!bVar26 * auVar43._56_4_;
        bVar26 = SUB81(uVar25 >> 0xf,0);
        local_a240._60_4_ = (uint)bVar26 * iVar86 | (uint)!bVar26 * auVar43._60_4_;
        bVar26 = (bool)((byte)uVar21 & 1);
        local_a200._0_4_ = (uint)bVar26 * iVar39 | (uint)!bVar26 * auVar44._0_4_;
        bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
        local_a200._4_4_ = (uint)bVar26 * iVar72 | (uint)!bVar26 * auVar44._4_4_;
        bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
        local_a200._8_4_ = (uint)bVar26 * iVar73 | (uint)!bVar26 * auVar44._8_4_;
        bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
        local_a200._12_4_ = (uint)bVar26 * iVar74 | (uint)!bVar26 * auVar44._12_4_;
        bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
        local_a200._16_4_ = (uint)bVar26 * iVar75 | (uint)!bVar26 * auVar44._16_4_;
        bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
        local_a200._20_4_ = (uint)bVar26 * iVar76 | (uint)!bVar26 * auVar44._20_4_;
        bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
        local_a200._24_4_ = (uint)bVar26 * iVar77 | (uint)!bVar26 * auVar44._24_4_;
        bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
        local_a200._28_4_ = (uint)bVar26 * iVar78 | (uint)!bVar26 * auVar44._28_4_;
        bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
        local_a200._32_4_ = (uint)bVar26 * iVar79 | (uint)!bVar26 * auVar44._32_4_;
        bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
        local_a200._36_4_ = (uint)bVar26 * iVar80 | (uint)!bVar26 * auVar44._36_4_;
        bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
        local_a200._40_4_ = (uint)bVar26 * iVar81 | (uint)!bVar26 * auVar44._40_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
        local_a200._44_4_ = (uint)bVar26 * iVar82 | (uint)!bVar26 * auVar44._44_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
        local_a200._48_4_ = (uint)bVar26 * iVar83 | (uint)!bVar26 * auVar44._48_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
        local_a200._52_4_ = (uint)bVar26 * iVar84 | (uint)!bVar26 * auVar44._52_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
        local_a200._56_4_ = (uint)bVar26 * iVar85 | (uint)!bVar26 * auVar44._56_4_;
        bVar26 = SUB81(uVar21 >> 0xf,0);
        local_a200._60_4_ = (uint)bVar26 * iVar86 | (uint)!bVar26 * auVar44._60_4_;
        bVar26 = (bool)((byte)uVar30 & 1);
        local_a1c0._0_4_ = (uint)bVar26 * iVar39 | (uint)!bVar26 * auVar46._0_4_;
        bVar26 = (bool)((byte)(uVar30 >> 1) & 1);
        local_a1c0._4_4_ = (uint)bVar26 * iVar72 | (uint)!bVar26 * auVar46._4_4_;
        bVar26 = (bool)((byte)(uVar30 >> 2) & 1);
        local_a1c0._8_4_ = (uint)bVar26 * iVar73 | (uint)!bVar26 * auVar46._8_4_;
        bVar26 = (bool)((byte)(uVar30 >> 3) & 1);
        local_a1c0._12_4_ = (uint)bVar26 * iVar74 | (uint)!bVar26 * auVar46._12_4_;
        bVar26 = (bool)((byte)(uVar30 >> 4) & 1);
        local_a1c0._16_4_ = (uint)bVar26 * iVar75 | (uint)!bVar26 * auVar46._16_4_;
        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
        local_a1c0._20_4_ = (uint)bVar26 * iVar76 | (uint)!bVar26 * auVar46._20_4_;
        bVar26 = (bool)((byte)(uVar30 >> 6) & 1);
        local_a1c0._24_4_ = (uint)bVar26 * iVar77 | (uint)!bVar26 * auVar46._24_4_;
        bVar26 = (bool)((byte)(uVar30 >> 7) & 1);
        local_a1c0._28_4_ = (uint)bVar26 * iVar78 | (uint)!bVar26 * auVar46._28_4_;
        bVar26 = (bool)((byte)(uVar30 >> 8) & 1);
        local_a1c0._32_4_ = (uint)bVar26 * iVar79 | (uint)!bVar26 * auVar46._32_4_;
        bVar26 = (bool)((byte)(uVar30 >> 9) & 1);
        local_a1c0._36_4_ = (uint)bVar26 * iVar80 | (uint)!bVar26 * auVar46._36_4_;
        bVar26 = (bool)((byte)(uVar30 >> 10) & 1);
        local_a1c0._40_4_ = (uint)bVar26 * iVar81 | (uint)!bVar26 * auVar46._40_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xb) & 1);
        local_a1c0._44_4_ = (uint)bVar26 * iVar82 | (uint)!bVar26 * auVar46._44_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xc) & 1);
        local_a1c0._48_4_ = (uint)bVar26 * iVar83 | (uint)!bVar26 * auVar46._48_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
        local_a1c0._52_4_ = (uint)bVar26 * iVar84 | (uint)!bVar26 * auVar46._52_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xe) & 1);
        local_a1c0._56_4_ = (uint)bVar26 * iVar85 | (uint)!bVar26 * auVar46._56_4_;
        bVar26 = SUB81(uVar30 >> 0xf,0);
        local_a1c0._60_4_ = (uint)bVar26 * iVar86 | (uint)!bVar26 * auVar46._60_4_;
        uVar25 = vcmpps_avx512f(local_a240,auVar87,1);
        auVar42 = vpbroadcastd_avx512f(ZEXT416(0x20));
        auVar43._4_4_ = (uint)((byte)(uVar25 >> 1) & 1) * auVar42._4_4_;
        auVar43._0_4_ = (uint)((byte)uVar25 & 1) * auVar42._0_4_;
        auVar43._8_4_ = (uint)((byte)(uVar25 >> 2) & 1) * auVar42._8_4_;
        auVar43._12_4_ = (uint)((byte)(uVar25 >> 3) & 1) * auVar42._12_4_;
        auVar43._16_4_ = (uint)((byte)(uVar25 >> 4) & 1) * auVar42._16_4_;
        auVar43._20_4_ = (uint)((byte)(uVar25 >> 5) & 1) * auVar42._20_4_;
        auVar43._24_4_ = (uint)((byte)(uVar25 >> 6) & 1) * auVar42._24_4_;
        auVar43._28_4_ = (uint)((byte)(uVar25 >> 7) & 1) * auVar42._28_4_;
        auVar43._32_4_ = (uint)((byte)(uVar25 >> 8) & 1) * auVar42._32_4_;
        auVar43._36_4_ = (uint)((byte)(uVar25 >> 9) & 1) * auVar42._36_4_;
        auVar43._40_4_ = (uint)((byte)(uVar25 >> 10) & 1) * auVar42._40_4_;
        auVar43._44_4_ = (uint)((byte)(uVar25 >> 0xb) & 1) * auVar42._44_4_;
        auVar43._48_4_ = (uint)((byte)(uVar25 >> 0xc) & 1) * auVar42._48_4_;
        auVar43._52_4_ = (uint)((byte)(uVar25 >> 0xd) & 1) * auVar42._52_4_;
        auVar43._56_4_ = (uint)((byte)(uVar25 >> 0xe) & 1) * auVar42._56_4_;
        auVar43._60_4_ = (uint)(byte)(uVar25 >> 0xf) * auVar42._60_4_;
        local_a180 = vmovdqa64_avx512f(auVar43);
        uVar25 = vcmpps_avx512f(local_a200,auVar87,5);
        auVar42 = vpbroadcastd_avx512f(ZEXT416(0x60));
        auVar43 = vpbroadcastd_avx512f(ZEXT416(0x40));
        bVar26 = (bool)((byte)uVar25 & 1);
        auVar44._0_4_ = (uint)bVar26 * auVar43._0_4_ | (uint)!bVar26 * auVar42._0_4_;
        bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar44._4_4_ = (uint)bVar26 * auVar43._4_4_ | (uint)!bVar26 * auVar42._4_4_;
        bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar44._8_4_ = (uint)bVar26 * auVar43._8_4_ | (uint)!bVar26 * auVar42._8_4_;
        bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar44._12_4_ = (uint)bVar26 * auVar43._12_4_ | (uint)!bVar26 * auVar42._12_4_;
        bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar44._16_4_ = (uint)bVar26 * auVar43._16_4_ | (uint)!bVar26 * auVar42._16_4_;
        bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar44._20_4_ = (uint)bVar26 * auVar43._20_4_ | (uint)!bVar26 * auVar42._20_4_;
        bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar44._24_4_ = (uint)bVar26 * auVar43._24_4_ | (uint)!bVar26 * auVar42._24_4_;
        bVar26 = (bool)((byte)(uVar25 >> 7) & 1);
        auVar44._28_4_ = (uint)bVar26 * auVar43._28_4_ | (uint)!bVar26 * auVar42._28_4_;
        bVar26 = (bool)((byte)(uVar25 >> 8) & 1);
        auVar44._32_4_ = (uint)bVar26 * auVar43._32_4_ | (uint)!bVar26 * auVar42._32_4_;
        bVar26 = (bool)((byte)(uVar25 >> 9) & 1);
        auVar44._36_4_ = (uint)bVar26 * auVar43._36_4_ | (uint)!bVar26 * auVar42._36_4_;
        bVar26 = (bool)((byte)(uVar25 >> 10) & 1);
        auVar44._40_4_ = (uint)bVar26 * auVar43._40_4_ | (uint)!bVar26 * auVar42._40_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xb) & 1);
        auVar44._44_4_ = (uint)bVar26 * auVar43._44_4_ | (uint)!bVar26 * auVar42._44_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xc) & 1);
        auVar44._48_4_ = (uint)bVar26 * auVar43._48_4_ | (uint)!bVar26 * auVar42._48_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xd) & 1);
        auVar44._52_4_ = (uint)bVar26 * auVar43._52_4_ | (uint)!bVar26 * auVar42._52_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xe) & 1);
        auVar44._56_4_ = (uint)bVar26 * auVar43._56_4_ | (uint)!bVar26 * auVar42._56_4_;
        bVar26 = SUB81(uVar25 >> 0xf,0);
        auVar44._60_4_ = (uint)bVar26 * auVar43._60_4_ | (uint)!bVar26 * auVar42._60_4_;
        local_a140 = vmovdqa64_avx512f(auVar44);
        uVar25 = vcmpps_avx512f(local_a1c0,auVar87,5);
        auVar42 = vpbroadcastd_avx512f(ZEXT416(0xa0));
        auVar43 = vpbroadcastd_avx512f(ZEXT416(0x80));
        bVar26 = (bool)((byte)uVar25 & 1);
        auVar45._0_4_ = (uint)bVar26 * auVar43._0_4_ | (uint)!bVar26 * auVar42._0_4_;
        bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar26 * auVar43._4_4_ | (uint)!bVar26 * auVar42._4_4_;
        bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar26 * auVar43._8_4_ | (uint)!bVar26 * auVar42._8_4_;
        bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar26 * auVar43._12_4_ | (uint)!bVar26 * auVar42._12_4_;
        bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar26 * auVar43._16_4_ | (uint)!bVar26 * auVar42._16_4_;
        bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar26 * auVar43._20_4_ | (uint)!bVar26 * auVar42._20_4_;
        bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar26 * auVar43._24_4_ | (uint)!bVar26 * auVar42._24_4_;
        bVar26 = (bool)((byte)(uVar25 >> 7) & 1);
        auVar45._28_4_ = (uint)bVar26 * auVar43._28_4_ | (uint)!bVar26 * auVar42._28_4_;
        bVar26 = (bool)((byte)(uVar25 >> 8) & 1);
        auVar45._32_4_ = (uint)bVar26 * auVar43._32_4_ | (uint)!bVar26 * auVar42._32_4_;
        bVar26 = (bool)((byte)(uVar25 >> 9) & 1);
        auVar45._36_4_ = (uint)bVar26 * auVar43._36_4_ | (uint)!bVar26 * auVar42._36_4_;
        bVar26 = (bool)((byte)(uVar25 >> 10) & 1);
        auVar45._40_4_ = (uint)bVar26 * auVar43._40_4_ | (uint)!bVar26 * auVar42._40_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xb) & 1);
        auVar45._44_4_ = (uint)bVar26 * auVar43._44_4_ | (uint)!bVar26 * auVar42._44_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xc) & 1);
        auVar45._48_4_ = (uint)bVar26 * auVar43._48_4_ | (uint)!bVar26 * auVar42._48_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xd) & 1);
        auVar45._52_4_ = (uint)bVar26 * auVar43._52_4_ | (uint)!bVar26 * auVar42._52_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xe) & 1);
        auVar45._56_4_ = (uint)bVar26 * auVar43._56_4_ | (uint)!bVar26 * auVar42._56_4_;
        bVar26 = SUB81(uVar25 >> 0xf,0);
        auVar45._60_4_ = (uint)bVar26 * auVar43._60_4_ | (uint)!bVar26 * auVar42._60_4_;
        local_a100 = vmovdqa64_avx512f(auVar45);
        auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
        auVar43 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar87);
        bVar26 = (bool)((byte)uVar38 & 1);
        local_a0c0 = (uint)bVar26 * auVar43._0_4_ | (uint)!bVar26 * auVar42._0_4_;
        bVar26 = (bool)((byte)(uVar38 >> 1) & 1);
        uStack_8c7c = (uint)bVar26 * auVar43._4_4_ | (uint)!bVar26 * auVar42._4_4_;
        bVar26 = (bool)((byte)(uVar38 >> 2) & 1);
        uStack_8c78 = (uint)bVar26 * auVar43._8_4_ | (uint)!bVar26 * auVar42._8_4_;
        bVar26 = (bool)((byte)(uVar38 >> 3) & 1);
        uStack_8c74 = (uint)bVar26 * auVar43._12_4_ | (uint)!bVar26 * auVar42._12_4_;
        bVar26 = (bool)((byte)(uVar38 >> 4) & 1);
        uStack_8c70 = (uint)bVar26 * auVar43._16_4_ | (uint)!bVar26 * auVar42._16_4_;
        bVar26 = (bool)((byte)(uVar38 >> 5) & 1);
        uStack_8c6c = (uint)bVar26 * auVar43._20_4_ | (uint)!bVar26 * auVar42._20_4_;
        bVar26 = (bool)((byte)(uVar38 >> 6) & 1);
        uStack_8c68 = (uint)bVar26 * auVar43._24_4_ | (uint)!bVar26 * auVar42._24_4_;
        bVar26 = (bool)((byte)(uVar38 >> 7) & 1);
        uStack_8c64 = (uint)bVar26 * auVar43._28_4_ | (uint)!bVar26 * auVar42._28_4_;
        bVar11 = (byte)(uVar38 >> 8);
        bVar26 = (bool)(bVar11 & 1);
        uStack_8c60 = (uint)bVar26 * auVar43._32_4_ | (uint)!bVar26 * auVar42._32_4_;
        bVar26 = (bool)((byte)(uVar38 >> 9) & 1);
        uStack_8c5c = (uint)bVar26 * auVar43._36_4_ | (uint)!bVar26 * auVar42._36_4_;
        bVar26 = (bool)((byte)(uVar38 >> 10) & 1);
        uStack_8c58 = (uint)bVar26 * auVar43._40_4_ | (uint)!bVar26 * auVar42._40_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xb) & 1);
        uStack_8c54 = (uint)bVar26 * auVar43._44_4_ | (uint)!bVar26 * auVar42._44_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
        uStack_8c50 = (uint)bVar26 * auVar43._48_4_ | (uint)!bVar26 * auVar42._48_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xd) & 1);
        uStack_8c4c = (uint)bVar26 * auVar43._52_4_ | (uint)!bVar26 * auVar42._52_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xe) & 1);
        uStack_8c48 = (uint)bVar26 * auVar43._56_4_ | (uint)!bVar26 * auVar42._56_4_;
        bVar26 = SUB81(uVar38 >> 0xf,0);
        uStack_8c44 = (uint)bVar26 * auVar43._60_4_ | (uint)!bVar26 * auVar42._60_4_;
        uStack_a0bc = uStack_8c7c;
        uStack_a0b8 = uStack_8c78;
        uStack_a0b4 = uStack_8c74;
        uStack_a0b0 = uStack_8c70;
        uStack_a0ac = uStack_8c6c;
        uStack_a0a8 = uStack_8c68;
        uStack_a0a4 = uStack_8c64;
        uStack_a0a0 = uStack_8c60;
        uStack_a09c = uStack_8c5c;
        uStack_a098 = uStack_8c58;
        uStack_a094 = uStack_8c54;
        uStack_a090 = uStack_8c50;
        uStack_a08c = uStack_8c4c;
        uStack_a088 = uStack_8c48;
        uStack_a084 = uStack_8c44;
        auVar43 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        local_a948 = (uint)uVar38;
        auVar87 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar87);
        bVar26 = (bool)((byte)uVar38 & 1);
        bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar38 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar38 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar38 >> 6) & 1);
        bVar10 = (bool)((byte)(uVar38 >> 7) & 1);
        bVar12 = (bool)(bVar11 & 1);
        bVar13 = (bool)((byte)(uVar38 >> 9) & 1);
        bVar14 = (bool)((byte)(uVar38 >> 10) & 1);
        bVar15 = (bool)((byte)(uVar38 >> 0xb) & 1);
        bVar16 = (bool)((byte)(uVar38 >> 0xc) & 1);
        bVar17 = (bool)((byte)(uVar38 >> 0xd) & 1);
        bVar18 = (bool)((byte)(uVar38 >> 0xe) & 1);
        bVar19 = SUB81(uVar38 >> 0xf,0);
        local_a080 = (uint)bVar26 * auVar87._0_4_ | (uint)!bVar26 * auVar43._0_4_;
        uStack_a07c = (uint)bVar4 * auVar87._4_4_ | (uint)!bVar4 * auVar43._4_4_;
        uStack_a078 = (uint)bVar5 * auVar87._8_4_ | (uint)!bVar5 * auVar43._8_4_;
        uStack_a074 = (uint)bVar6 * auVar87._12_4_ | (uint)!bVar6 * auVar43._12_4_;
        uStack_a070 = (uint)bVar7 * auVar87._16_4_ | (uint)!bVar7 * auVar43._16_4_;
        uStack_a06c = (uint)bVar8 * auVar87._20_4_ | (uint)!bVar8 * auVar43._20_4_;
        uStack_a068 = (uint)bVar9 * auVar87._24_4_ | (uint)!bVar9 * auVar43._24_4_;
        uStack_a064 = (uint)bVar10 * auVar87._28_4_ | (uint)!bVar10 * auVar43._28_4_;
        uStack_a060 = (uint)bVar12 * auVar87._32_4_ | (uint)!bVar12 * auVar43._32_4_;
        uStack_a05c = (uint)bVar13 * auVar87._36_4_ | (uint)!bVar13 * auVar43._36_4_;
        uStack_a058 = (uint)bVar14 * auVar87._40_4_ | (uint)!bVar14 * auVar43._40_4_;
        uStack_a054 = (uint)bVar15 * auVar87._44_4_ | (uint)!bVar15 * auVar43._44_4_;
        uStack_a050 = (uint)bVar16 * auVar87._48_4_ | (uint)!bVar16 * auVar43._48_4_;
        uStack_a04c = (uint)bVar17 * auVar87._52_4_ | (uint)!bVar17 * auVar43._52_4_;
        uStack_a048 = (uint)bVar18 * auVar87._56_4_ | (uint)!bVar18 * auVar43._56_4_;
        uStack_a044 = (uint)bVar19 * auVar87._60_4_ | (uint)!bVar19 * auVar43._60_4_;
        local_a97c = (uint)(ushort)~(ushort)uVar38;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar33 = 0xe;
        }
        else {
          uVar33 = 2;
          if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)
          {
            uVar33 = 0xe;
          }
        }
        local_a950 = ray + 0x200;
        puVar34 = local_9e40;
        local_9e50 = 0xfffffffffffffff8;
        pauVar28 = (undefined1 (*) [64])local_8c40;
        local_8c80 = local_a0c0;
        local_a938 = (undefined1 (*) [32])local_a500;
        auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
        auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
        auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
        auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        local_a8a0 = This;
        local_8cc0 = auVar42;
LAB_01e447e2:
        do {
          auVar46._4_4_ = uStack_a07c;
          auVar46._0_4_ = local_a080;
          auVar46._8_4_ = uStack_a078;
          auVar46._12_4_ = uStack_a074;
          auVar46._16_4_ = uStack_a070;
          auVar46._20_4_ = uStack_a06c;
          auVar46._24_4_ = uStack_a068;
          auVar46._28_4_ = uStack_a064;
          auVar46._32_4_ = uStack_a060;
          auVar46._36_4_ = uStack_a05c;
          auVar46._40_4_ = uStack_a058;
          auVar46._44_4_ = uStack_a054;
          auVar46._48_4_ = uStack_a050;
          auVar46._52_4_ = uStack_a04c;
          auVar46._56_4_ = uStack_a048;
          auVar46._60_4_ = uStack_a044;
          do {
            root.ptr = puVar34[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01e45c99;
            puVar34 = puVar34 + -1;
            auVar58 = pauVar28[-1];
            pauVar28 = pauVar28 + -1;
            uVar38 = vcmpps_avx512f(auVar58,auVar46,1);
          } while ((short)uVar38 == 0);
          uVar37 = (undefined4)uVar38;
          if (uVar33 < (uint)POPCOUNT(uVar37)) {
LAB_01e4482b:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01e45c99;
                auVar47._4_4_ = uStack_a07c;
                auVar47._0_4_ = local_a080;
                auVar47._8_4_ = uStack_a078;
                auVar47._12_4_ = uStack_a074;
                auVar47._16_4_ = uStack_a070;
                auVar47._20_4_ = uStack_a06c;
                auVar47._24_4_ = uStack_a068;
                auVar47._28_4_ = uStack_a064;
                auVar47._32_4_ = uStack_a060;
                auVar47._36_4_ = uStack_a05c;
                auVar47._40_4_ = uStack_a058;
                auVar47._44_4_ = uStack_a054;
                auVar47._48_4_ = uStack_a050;
                auVar47._52_4_ = uStack_a04c;
                auVar47._56_4_ = uStack_a048;
                auVar47._60_4_ = uStack_a044;
                uVar22 = vcmpps_avx512f(auVar58,auVar47,9);
                if ((short)uVar22 == 0) goto LAB_01e447e2;
                local_a898 = (ulong)((uint)root.ptr & 0xf) - 8;
                uVar29 = ~local_a97c;
                lVar27 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar32 = 0;
                goto LAB_01e44a35;
              }
              uVar38 = 8;
              auVar58 = auVar42;
              for (lVar27 = 0;
                  (lVar27 != 8 &&
                  (uVar25 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar27 * 8), uVar25 != 8));
                  lVar27 = lVar27 + 1) {
                auVar46 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x40 + lVar27 * 4)));
                auVar50._8_8_ = local_a3c0._8_8_;
                auVar50._0_8_ = local_a3c0._0_8_;
                auVar50._16_8_ = local_a3c0._16_8_;
                auVar50._24_8_ = local_a3c0._24_8_;
                auVar50._32_8_ = local_a3c0._32_8_;
                auVar50._40_8_ = local_a3c0._40_8_;
                auVar50._48_8_ = local_a3c0._48_8_;
                auVar50._56_8_ = local_a3c0._56_8_;
                auVar51._8_8_ = local_a3c0._72_8_;
                auVar51._0_8_ = local_a3c0._64_8_;
                auVar51._16_8_ = local_a3c0._80_8_;
                auVar51._24_8_ = local_a3c0._88_8_;
                auVar51._32_8_ = local_a3c0._96_8_;
                auVar51._40_8_ = local_a3c0._104_8_;
                auVar51._48_8_ = local_a3c0._112_8_;
                auVar51._56_8_ = local_a3c0._120_8_;
                auVar52._8_8_ = local_a3c0._136_8_;
                auVar52._0_8_ = local_a3c0._128_8_;
                auVar52._16_8_ = local_a3c0._144_8_;
                auVar52._24_8_ = local_a3c0._152_8_;
                auVar52._32_8_ = local_a3c0._160_8_;
                auVar52._40_8_ = local_a3c0._168_8_;
                auVar52._48_8_ = local_a3c0._176_8_;
                auVar52._56_8_ = local_a3c0._184_8_;
                auVar46 = vsubps_avx512f(auVar46,auVar50);
                auVar46 = vmulps_avx512f(local_a240,auVar46);
                auVar47 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x80 + lVar27 * 4)));
                auVar47 = vsubps_avx512f(auVar47,auVar51);
                auVar47 = vmulps_avx512f(local_a200,auVar47);
                auVar48 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xc0 + lVar27 * 4)));
                auVar48 = vsubps_avx512f(auVar48,auVar52);
                auVar48 = vmulps_avx512f(local_a1c0,auVar48);
                auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0x60 + lVar27 * 4)));
                auVar50 = vsubps_avx512f(auVar49,auVar50);
                auVar50 = vmulps_avx512f(local_a240,auVar50);
                auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xa0 + lVar27 * 4)));
                auVar51 = vsubps_avx512f(auVar49,auVar51);
                auVar51 = vmulps_avx512f(local_a200,auVar51);
                auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(root.ptr + 0xe0 + lVar27 * 4)));
                auVar52 = vsubps_avx512f(auVar49,auVar52);
                auVar52 = vmulps_avx512f(local_a1c0,auVar52);
                auVar49 = vminps_avx512f(auVar46,auVar50);
                auVar53 = vminps_avx512f(auVar47,auVar51);
                auVar49 = vmaxps_avx512f(auVar49,auVar53);
                auVar53 = vminps_avx512f(auVar48,auVar52);
                auVar49 = vmaxps_avx512f(auVar49,auVar53);
                auVar54 = vmulps_avx512f(auVar49,auVar87);
                auVar46 = vmaxps_avx512f(auVar46,auVar50);
                auVar47 = vmaxps_avx512f(auVar47,auVar51);
                auVar46 = vminps_avx512f(auVar46,auVar47);
                auVar47 = vmaxps_avx512f(auVar48,auVar52);
                auVar46 = vminps_avx512f(auVar46,auVar47);
                auVar46 = vmulps_avx512f(auVar46,auVar43);
                auVar48._4_4_ = uStack_a0bc;
                auVar48._0_4_ = local_a0c0;
                auVar48._8_4_ = uStack_a0b8;
                auVar48._12_4_ = uStack_a0b4;
                auVar48._16_4_ = uStack_a0b0;
                auVar48._20_4_ = uStack_a0ac;
                auVar48._24_4_ = uStack_a0a8;
                auVar48._28_4_ = uStack_a0a4;
                auVar48._32_4_ = uStack_a0a0;
                auVar48._36_4_ = uStack_a09c;
                auVar48._40_4_ = uStack_a098;
                auVar48._44_4_ = uStack_a094;
                auVar48._48_4_ = uStack_a090;
                auVar48._52_4_ = uStack_a08c;
                auVar48._56_4_ = uStack_a088;
                auVar48._60_4_ = uStack_a084;
                auVar47 = vmaxps_avx512f(auVar54,auVar48);
                auVar49._4_4_ = uStack_a07c;
                auVar49._0_4_ = local_a080;
                auVar49._8_4_ = uStack_a078;
                auVar49._12_4_ = uStack_a074;
                auVar49._16_4_ = uStack_a070;
                auVar49._20_4_ = uStack_a06c;
                auVar49._24_4_ = uStack_a068;
                auVar49._28_4_ = uStack_a064;
                auVar49._32_4_ = uStack_a060;
                auVar49._36_4_ = uStack_a05c;
                auVar49._40_4_ = uStack_a058;
                auVar49._44_4_ = uStack_a054;
                auVar49._48_4_ = uStack_a050;
                auVar49._52_4_ = uStack_a04c;
                auVar49._56_4_ = uStack_a048;
                auVar49._60_4_ = uStack_a044;
                auVar46 = vminps_avx512f(auVar46,auVar49);
                uVar21 = vcmpps_avx512f(auVar47,auVar46,2);
                uVar30 = uVar38;
                auVar53 = auVar58;
                if ((short)uVar21 != 0) {
                  auVar46 = vblendmps_avx512f(auVar42,auVar54);
                  bVar26 = (bool)((byte)uVar21 & 1);
                  auVar53._0_4_ = (uint)bVar26 * auVar46._0_4_ | (uint)!bVar26 * auVar54._0_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar26 * auVar46._4_4_ | (uint)!bVar26 * auVar54._4_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar26 * auVar46._8_4_ | (uint)!bVar26 * auVar54._8_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
                  auVar53._12_4_ = (uint)bVar26 * auVar46._12_4_ | (uint)!bVar26 * auVar54._12_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
                  auVar53._16_4_ = (uint)bVar26 * auVar46._16_4_ | (uint)!bVar26 * auVar54._16_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
                  auVar53._20_4_ = (uint)bVar26 * auVar46._20_4_ | (uint)!bVar26 * auVar54._20_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
                  auVar53._24_4_ = (uint)bVar26 * auVar46._24_4_ | (uint)!bVar26 * auVar54._24_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
                  auVar53._28_4_ = (uint)bVar26 * auVar46._28_4_ | (uint)!bVar26 * auVar54._28_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
                  auVar53._32_4_ = (uint)bVar26 * auVar46._32_4_ | (uint)!bVar26 * auVar54._32_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
                  auVar53._36_4_ = (uint)bVar26 * auVar46._36_4_ | (uint)!bVar26 * auVar54._36_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
                  auVar53._40_4_ = (uint)bVar26 * auVar46._40_4_ | (uint)!bVar26 * auVar54._40_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
                  auVar53._44_4_ = (uint)bVar26 * auVar46._44_4_ | (uint)!bVar26 * auVar54._44_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
                  auVar53._48_4_ = (uint)bVar26 * auVar46._48_4_ | (uint)!bVar26 * auVar54._48_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
                  auVar53._52_4_ = (uint)bVar26 * auVar46._52_4_ | (uint)!bVar26 * auVar54._52_4_;
                  bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
                  auVar53._56_4_ = (uint)bVar26 * auVar46._56_4_ | (uint)!bVar26 * auVar54._56_4_;
                  bVar26 = SUB81(uVar21 >> 0xf,0);
                  auVar53._60_4_ = (uint)bVar26 * auVar46._60_4_ | (uint)!bVar26 * auVar54._60_4_;
                  uVar30 = uVar25;
                  if (uVar38 != 8) {
                    *puVar34 = uVar38;
                    puVar34 = puVar34 + 1;
                    *pauVar28 = auVar58;
                    pauVar28 = pauVar28 + 1;
                  }
                }
                uVar38 = uVar30;
                auVar58 = auVar53;
              }
              if (uVar38 == 8) goto LAB_01e449dc;
              auVar54._4_4_ = uStack_a07c;
              auVar54._0_4_ = local_a080;
              auVar54._8_4_ = uStack_a078;
              auVar54._12_4_ = uStack_a074;
              auVar54._16_4_ = uStack_a070;
              auVar54._20_4_ = uStack_a06c;
              auVar54._24_4_ = uStack_a068;
              auVar54._28_4_ = uStack_a064;
              auVar54._32_4_ = uStack_a060;
              auVar54._36_4_ = uStack_a05c;
              auVar54._40_4_ = uStack_a058;
              auVar54._44_4_ = uStack_a054;
              auVar54._48_4_ = uStack_a050;
              auVar54._52_4_ = uStack_a04c;
              auVar54._56_4_ = uStack_a048;
              auVar54._60_4_ = uStack_a044;
              uVar22 = vcmpps_avx512f(auVar58,auVar54,9);
              root.ptr = uVar38;
            } while ((ushort)uVar33 < (ushort)POPCOUNT((int)uVar22));
            *puVar34 = uVar38;
            puVar34 = puVar34 + 1;
            *pauVar28 = auVar58;
            pauVar28 = pauVar28 + 1;
LAB_01e449dc:
            iVar39 = 4;
          }
          else {
            while (local_a880 = auVar58, uVar38 != 0) {
              k = 0;
              for (uVar25 = uVar38; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              uVar38 = uVar38 - 1 & uVar38;
              bVar26 = occluded1(local_a8a0,local_a8a8,root,k,&local_a951,ray,
                                 (TravRayK<16,_true> *)&local_a3c0.field_0,context);
              uVar29 = 1 << ((uint)k & 0x1f);
              if (!bVar26) {
                uVar29 = 0;
              }
              local_a97c = local_a97c | uVar29;
              auVar58 = local_a880;
            }
            iVar39 = 3;
            auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
            auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
            auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
            auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
            auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
            auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            if ((short)local_a97c != -1) {
              auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
              bVar26 = (bool)((byte)local_a97c & 1);
              bVar4 = (bool)((byte)(local_a97c >> 1) & 1);
              bVar5 = (bool)((byte)(local_a97c >> 2) & 1);
              bVar6 = (bool)((byte)(local_a97c >> 3) & 1);
              bVar7 = (bool)((byte)(local_a97c >> 4) & 1);
              bVar8 = (bool)((byte)(local_a97c >> 5) & 1);
              bVar9 = (bool)((byte)(local_a97c >> 6) & 1);
              bVar10 = (bool)((byte)(local_a97c >> 7) & 1);
              bVar12 = (bool)((byte)(local_a97c >> 8) & 1);
              bVar13 = (bool)((byte)(local_a97c >> 9) & 1);
              bVar14 = (bool)((byte)(local_a97c >> 10) & 1);
              bVar15 = (bool)((byte)(local_a97c >> 0xb) & 1);
              bVar16 = (bool)((byte)(local_a97c >> 0xc) & 1);
              bVar17 = (bool)((byte)(local_a97c >> 0xd) & 1);
              bVar18 = (bool)((byte)(local_a97c >> 0xe) & 1);
              bVar19 = (bool)((byte)(local_a97c >> 0xf) & 1);
              local_a080 = (uint)bVar26 * auVar46._0_4_ | !bVar26 * local_a080;
              uStack_a07c = (uint)bVar4 * auVar46._4_4_ | !bVar4 * uStack_a07c;
              uStack_a078 = (uint)bVar5 * auVar46._8_4_ | !bVar5 * uStack_a078;
              uStack_a074 = (uint)bVar6 * auVar46._12_4_ | !bVar6 * uStack_a074;
              uStack_a070 = (uint)bVar7 * auVar46._16_4_ | !bVar7 * uStack_a070;
              uStack_a06c = (uint)bVar8 * auVar46._20_4_ | !bVar8 * uStack_a06c;
              uStack_a068 = (uint)bVar9 * auVar46._24_4_ | !bVar9 * uStack_a068;
              uStack_a064 = (uint)bVar10 * auVar46._28_4_ | !bVar10 * uStack_a064;
              uStack_a060 = (uint)bVar12 * auVar46._32_4_ | !bVar12 * uStack_a060;
              uStack_a05c = (uint)bVar13 * auVar46._36_4_ | !bVar13 * uStack_a05c;
              uStack_a058 = (uint)bVar14 * auVar46._40_4_ | !bVar14 * uStack_a058;
              uStack_a054 = (uint)bVar15 * auVar46._44_4_ | !bVar15 * uStack_a054;
              uStack_a050 = (uint)bVar16 * auVar46._48_4_ | !bVar16 * uStack_a050;
              uStack_a04c = (uint)bVar17 * auVar46._52_4_ | !bVar17 * uStack_a04c;
              uStack_a048 = (uint)bVar18 * auVar46._56_4_ | !bVar18 * uStack_a048;
              uStack_a044 = (uint)bVar19 * auVar46._60_4_ | !bVar19 * uStack_a044;
              iVar39 = 2;
            }
            auVar58 = local_a880;
            if (uVar33 < (uint)POPCOUNT(uVar37)) goto LAB_01e4482b;
          }
        } while (iVar39 != 3);
LAB_01e45c99:
        local_a97c = local_a97c & local_a948;
        auVar40 = vbroadcastss_avx512f(ZEXT416(0xff800000));
        bVar26 = (bool)((byte)local_a97c & 1);
        bVar4 = (bool)((byte)(local_a97c >> 1) & 1);
        bVar5 = (bool)((byte)(local_a97c >> 2) & 1);
        bVar6 = (bool)((byte)(local_a97c >> 3) & 1);
        bVar7 = (bool)((byte)(local_a97c >> 4) & 1);
        bVar8 = (bool)((byte)(local_a97c >> 5) & 1);
        bVar9 = (bool)((byte)(local_a97c >> 6) & 1);
        bVar10 = (bool)((byte)(local_a97c >> 7) & 1);
        bVar12 = (bool)((byte)(local_a97c >> 8) & 1);
        bVar13 = (bool)((byte)(local_a97c >> 9) & 1);
        bVar14 = (bool)((byte)(local_a97c >> 10) & 1);
        bVar15 = (bool)((byte)(local_a97c >> 0xb) & 1);
        bVar16 = (bool)((byte)(local_a97c >> 0xc) & 1);
        bVar17 = (bool)((byte)(local_a97c >> 0xd) & 1);
        bVar18 = (bool)((byte)(local_a97c >> 0xe) & 1);
        bVar19 = (bool)((byte)(local_a97c >> 0xf) & 1);
        *(uint *)local_a950 = (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * *(int *)local_a950;
        *(uint *)(local_a950 + 4) =
             (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * *(int *)(local_a950 + 4);
        *(uint *)(local_a950 + 8) =
             (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * *(int *)(local_a950 + 8);
        *(uint *)(local_a950 + 0xc) =
             (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * *(int *)(local_a950 + 0xc);
        *(uint *)(local_a950 + 0x10) =
             (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * *(int *)(local_a950 + 0x10);
        *(uint *)(local_a950 + 0x14) =
             (uint)bVar8 * auVar40._20_4_ | (uint)!bVar8 * *(int *)(local_a950 + 0x14);
        *(uint *)(local_a950 + 0x18) =
             (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * *(int *)(local_a950 + 0x18);
        *(uint *)(local_a950 + 0x1c) =
             (uint)bVar10 * auVar40._28_4_ | (uint)!bVar10 * *(int *)(local_a950 + 0x1c);
        *(uint *)(local_a950 + 0x20) =
             (uint)bVar12 * auVar40._32_4_ | (uint)!bVar12 * *(int *)(local_a950 + 0x20);
        *(uint *)(local_a950 + 0x24) =
             (uint)bVar13 * auVar40._36_4_ | (uint)!bVar13 * *(int *)(local_a950 + 0x24);
        *(uint *)(local_a950 + 0x28) =
             (uint)bVar14 * auVar40._40_4_ | (uint)!bVar14 * *(int *)(local_a950 + 0x28);
        *(uint *)(local_a950 + 0x2c) =
             (uint)bVar15 * auVar40._44_4_ | (uint)!bVar15 * *(int *)(local_a950 + 0x2c);
        *(uint *)(local_a950 + 0x30) =
             (uint)bVar16 * auVar40._48_4_ | (uint)!bVar16 * *(int *)(local_a950 + 0x30);
        *(uint *)(local_a950 + 0x34) =
             (uint)bVar17 * auVar40._52_4_ | (uint)!bVar17 * *(int *)(local_a950 + 0x34);
        *(uint *)(local_a950 + 0x38) =
             (uint)bVar18 * auVar40._56_4_ | (uint)!bVar18 * *(int *)(local_a950 + 0x38);
        *(uint *)(local_a950 + 0x3c) =
             (uint)bVar19 * auVar40._60_4_ | (uint)!bVar19 * *(int *)(local_a950 + 0x3c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01e44a35:
  do {
    if (lVar32 == local_a898) goto LAB_01e45b4a;
    local_a888 = lVar32 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    lVar35 = 0;
    local_a890 = lVar32;
    uVar31 = uVar29;
    do {
      auVar46 = _local_a900;
      uVar36 = (ushort)uVar31;
      if (lVar35 == 4) goto LAB_01e45b2a;
      uVar38 = CONCAT44(0,*(uint *)(lVar27 + lVar35 * 4));
      local_a880._0_8_ = uVar38;
      if (uVar38 == 0xffffffff) goto LAB_01e45b2a;
      auVar49 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0xc0 + lVar35 * 4)));
      auVar53 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0xb0 + lVar35 * 4)));
      auVar54 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0xa0 + lVar35 * 4)));
      local_a7c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x90 + lVar35 * 4)));
      local_a800 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x80 + lVar35 * 4)));
      local_9ec0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x70 + lVar35 * 4)));
      local_9f00 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x60 + lVar35 * 4)));
      local_9f40 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x50 + lVar35 * 4)));
      local_9f80 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x40 + lVar35 * 4)));
      local_9fc0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x30 + lVar35 * 4)));
      local_a000 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x20 + lVar35 * 4)));
      local_a040 = vbroadcastss_avx512f(ZEXT416(*(uint *)(lVar27 + -0x10 + lVar35 * 4)));
      local_a810 = *(undefined8 *)(local_a888 + 0xd0);
      uStack_a808 = *(undefined8 *)(local_a888 + 0xd8);
      auVar58 = *(undefined1 (*) [64])ray;
      auVar47 = *(undefined1 (*) [64])(ray + 0x40);
      auVar50 = *(undefined1 (*) [64])(ray + 0x80);
      auVar51 = *(undefined1 (*) [64])(ray + 0x100);
      auVar52 = *(undefined1 (*) [64])(ray + 0x140);
      auVar48 = *(undefined1 (*) [64])(ray + 0x180);
      auVar49 = vsubps_avx512f(auVar49,auVar58);
      auVar53 = vsubps_avx512f(auVar53,auVar47);
      auVar54 = vsubps_avx512f(auVar54,auVar50);
      auVar55 = vsubps_avx512f(local_a7c0,auVar58);
      auVar56 = vsubps_avx512f(local_a800,auVar47);
      auVar57 = vsubps_avx512f(local_9ec0,auVar50);
      auVar58 = vsubps_avx512f(local_9fc0,auVar58);
      auVar47 = vsubps_avx512f(local_a000,auVar47);
      auVar50 = vsubps_avx512f(local_a040,auVar50);
      auVar59 = vsubps_avx512f(auVar58,auVar49);
      auVar60 = vsubps_avx512f(auVar47,auVar53);
      auVar61 = vsubps_avx512f(auVar50,auVar54);
      auVar62 = vsubps_avx512f(auVar49,auVar55);
      auVar63 = vsubps_avx512f(auVar53,auVar56);
      auVar64 = vsubps_avx512f(auVar54,auVar57);
      auVar65 = vaddps_avx512f(auVar58,auVar49);
      auVar66 = vaddps_avx512f(auVar47,auVar53);
      auVar67 = vaddps_avx512f(auVar50,auVar54);
      auVar68 = vmulps_avx512f(auVar66,auVar61);
      auVar68 = vfmsub231ps_avx512f(auVar68,auVar60,auVar67);
      auVar67 = vmulps_avx512f(auVar67,auVar59);
      auVar67 = vfmsub231ps_avx512f(auVar67,auVar61,auVar65);
      auVar65 = vmulps_avx512f(auVar65,auVar60);
      auVar65 = vfmsub231ps_avx512f(auVar65,auVar59,auVar66);
      auVar65 = vmulps_avx512f(auVar65,auVar48);
      auVar65 = vfmadd231ps_avx512f(auVar65,auVar52,auVar67);
      auVar65 = vfmadd231ps_avx512f(auVar65,auVar51,auVar68);
      auVar66 = vaddps_avx512f(auVar49,auVar55);
      auVar67 = vaddps_avx512f(auVar53,auVar56);
      auVar68 = vaddps_avx512f(auVar54,auVar57);
      auVar69 = vmulps_avx512f(auVar67,auVar64);
      auVar69 = vfmsub231ps_avx512f(auVar69,auVar63,auVar68);
      auVar68 = vmulps_avx512f(auVar68,auVar62);
      auVar68 = vfmsub231ps_avx512f(auVar68,auVar64,auVar66);
      auVar66 = vmulps_avx512f(auVar66,auVar63);
      auVar66 = vfmsub231ps_avx512f(auVar66,auVar62,auVar67);
      auVar67 = vsubps_avx512f(auVar55,auVar58);
      auVar66 = vmulps_avx512f(auVar66,auVar48);
      auVar66 = vfmadd231ps_avx512f(auVar66,auVar52,auVar68);
      auVar68 = vsubps_avx512f(auVar56,auVar47);
      auVar66 = vfmadd231ps_avx512f(auVar66,auVar51,auVar69);
      auVar69 = vsubps_avx512f(auVar57,auVar50);
      auVar58 = vaddps_avx512f(auVar55,auVar58);
      auVar47 = vaddps_avx512f(auVar56,auVar47);
      auVar50 = vaddps_avx512f(auVar57,auVar50);
      auVar55 = vmulps_avx512f(auVar47,auVar69);
      auVar55 = vfmsub231ps_avx512f(auVar55,auVar68,auVar50);
      auVar50 = vmulps_avx512f(auVar50,auVar67);
      auVar50 = vfmsub231ps_avx512f(auVar50,auVar69,auVar58);
      auVar58 = vmulps_avx512f(auVar58,auVar68);
      auVar58 = vfmsub231ps_avx512f(auVar58,auVar67,auVar47);
      auVar58 = vmulps_avx512f(auVar58,auVar48);
      auVar58 = vfmadd231ps_avx512f(auVar58,auVar52,auVar50);
      auVar58 = vfmadd231ps_avx512f(auVar58,auVar51,auVar55);
      auVar47 = vaddps_avx512f(auVar65,auVar66);
      auVar47 = vaddps_avx512f(auVar58,auVar47);
      auVar50 = vandps_avx512dq(auVar47,auVar40);
      auVar55 = vmulps_avx512f(auVar50,auVar44);
      auVar56 = vminps_avx512f(auVar65,auVar66);
      auVar56 = vminps_avx512f(auVar56,auVar58);
      auVar57 = vxorps_avx512dq(auVar55,auVar45);
      uVar22 = vcmpps_avx512f(auVar56,auVar57,5);
      auVar56 = vmaxps_avx512f(auVar65,auVar66);
      auVar58 = vmaxps_avx512f(auVar56,auVar58);
      uVar23 = vcmpps_avx512f(auVar58,auVar55,2);
      uVar36 = ((ushort)uVar22 | (ushort)uVar23) & uVar36;
      if (uVar36 != 0) {
        auVar58 = vmulps_avx512f(auVar63,auVar61);
        auVar55 = vmulps_avx512f(auVar59,auVar64);
        auVar56 = vmulps_avx512f(auVar62,auVar60);
        auVar57 = vmulps_avx512f(auVar68,auVar64);
        auVar70 = vmulps_avx512f(auVar62,auVar69);
        auVar71 = vmulps_avx512f(auVar67,auVar63);
        auVar60 = vfmsub213ps_avx512f(auVar60,auVar64,auVar58);
        auVar61 = vfmsub213ps_avx512f(auVar61,auVar62,auVar55);
        auVar59 = vfmsub213ps_avx512f(auVar59,auVar63,auVar56);
        auVar63 = vfmsub213ps_avx512f(auVar69,auVar63,auVar57);
        auVar64 = vfmsub213ps_avx512f(auVar67,auVar64,auVar70);
        auVar62 = vfmsub213ps_avx512f(auVar68,auVar62,auVar71);
        auVar58 = vandps_avx512dq(auVar58,auVar40);
        auVar57 = vandps_avx512dq(auVar57,auVar40);
        uVar25 = vcmpps_avx512f(auVar58,auVar57,1);
        auVar58 = vandps_avx512dq(auVar55,auVar40);
        auVar55 = vandps_avx512dq(auVar70,auVar40);
        uVar21 = vcmpps_avx512f(auVar58,auVar55,1);
        auVar58 = vandps_avx512dq(auVar56,auVar40);
        auVar55 = vandps_avx512dq(auVar71,auVar40);
        uVar30 = vcmpps_avx512f(auVar58,auVar55,1);
        bVar26 = (bool)((byte)uVar25 & 1);
        local_a6c0._0_4_ = (uint)bVar26 * auVar60._0_4_ | (uint)!bVar26 * auVar63._0_4_;
        bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
        local_a6c0._4_4_ = (uint)bVar26 * auVar60._4_4_ | (uint)!bVar26 * auVar63._4_4_;
        bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
        local_a6c0._8_4_ = (uint)bVar26 * auVar60._8_4_ | (uint)!bVar26 * auVar63._8_4_;
        bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
        local_a6c0._12_4_ = (uint)bVar26 * auVar60._12_4_ | (uint)!bVar26 * auVar63._12_4_;
        bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
        local_a6c0._16_4_ = (uint)bVar26 * auVar60._16_4_ | (uint)!bVar26 * auVar63._16_4_;
        bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
        local_a6c0._20_4_ = (uint)bVar26 * auVar60._20_4_ | (uint)!bVar26 * auVar63._20_4_;
        bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
        local_a6c0._24_4_ = (uint)bVar26 * auVar60._24_4_ | (uint)!bVar26 * auVar63._24_4_;
        bVar26 = (bool)((byte)(uVar25 >> 7) & 1);
        local_a6c0._28_4_ = (uint)bVar26 * auVar60._28_4_ | (uint)!bVar26 * auVar63._28_4_;
        bVar26 = (bool)((byte)(uVar25 >> 8) & 1);
        local_a6c0._32_4_ = (uint)bVar26 * auVar60._32_4_ | (uint)!bVar26 * auVar63._32_4_;
        bVar26 = (bool)((byte)(uVar25 >> 9) & 1);
        local_a6c0._36_4_ = (uint)bVar26 * auVar60._36_4_ | (uint)!bVar26 * auVar63._36_4_;
        bVar26 = (bool)((byte)(uVar25 >> 10) & 1);
        local_a6c0._40_4_ = (uint)bVar26 * auVar60._40_4_ | (uint)!bVar26 * auVar63._40_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xb) & 1);
        local_a6c0._44_4_ = (uint)bVar26 * auVar60._44_4_ | (uint)!bVar26 * auVar63._44_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xc) & 1);
        local_a6c0._48_4_ = (uint)bVar26 * auVar60._48_4_ | (uint)!bVar26 * auVar63._48_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xd) & 1);
        local_a6c0._52_4_ = (uint)bVar26 * auVar60._52_4_ | (uint)!bVar26 * auVar63._52_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xe) & 1);
        local_a6c0._56_4_ = (uint)bVar26 * auVar60._56_4_ | (uint)!bVar26 * auVar63._56_4_;
        bVar26 = SUB81(uVar25 >> 0xf,0);
        local_a6c0._60_4_ = (uint)bVar26 * auVar60._60_4_ | (uint)!bVar26 * auVar63._60_4_;
        bVar26 = (bool)((byte)uVar21 & 1);
        local_a6c0._64_4_ = (uint)bVar26 * auVar61._0_4_ | (uint)!bVar26 * auVar64._0_4_;
        bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
        local_a6c0._68_4_ = (uint)bVar26 * auVar61._4_4_ | (uint)!bVar26 * auVar64._4_4_;
        bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
        local_a6c0._72_4_ = (uint)bVar26 * auVar61._8_4_ | (uint)!bVar26 * auVar64._8_4_;
        bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
        local_a6c0._76_4_ = (uint)bVar26 * auVar61._12_4_ | (uint)!bVar26 * auVar64._12_4_;
        bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
        local_a6c0._80_4_ = (uint)bVar26 * auVar61._16_4_ | (uint)!bVar26 * auVar64._16_4_;
        bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
        local_a6c0._84_4_ = (uint)bVar26 * auVar61._20_4_ | (uint)!bVar26 * auVar64._20_4_;
        bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
        local_a6c0._88_4_ = (uint)bVar26 * auVar61._24_4_ | (uint)!bVar26 * auVar64._24_4_;
        bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
        local_a6c0._92_4_ = (uint)bVar26 * auVar61._28_4_ | (uint)!bVar26 * auVar64._28_4_;
        bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
        local_a6c0._96_4_ = (uint)bVar26 * auVar61._32_4_ | (uint)!bVar26 * auVar64._32_4_;
        bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
        local_a6c0._100_4_ = (uint)bVar26 * auVar61._36_4_ | (uint)!bVar26 * auVar64._36_4_;
        bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
        local_a6c0._104_4_ = (uint)bVar26 * auVar61._40_4_ | (uint)!bVar26 * auVar64._40_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
        local_a6c0._108_4_ = (uint)bVar26 * auVar61._44_4_ | (uint)!bVar26 * auVar64._44_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
        local_a6c0._112_4_ = (uint)bVar26 * auVar61._48_4_ | (uint)!bVar26 * auVar64._48_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
        local_a6c0._116_4_ = (uint)bVar26 * auVar61._52_4_ | (uint)!bVar26 * auVar64._52_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
        local_a6c0._120_4_ = (uint)bVar26 * auVar61._56_4_ | (uint)!bVar26 * auVar64._56_4_;
        bVar26 = SUB81(uVar21 >> 0xf,0);
        local_a6c0._124_4_ = (uint)bVar26 * auVar61._60_4_ | (uint)!bVar26 * auVar64._60_4_;
        bVar26 = (bool)((byte)uVar30 & 1);
        local_a6c0._128_4_ = (uint)bVar26 * auVar59._0_4_ | (uint)!bVar26 * auVar62._0_4_;
        bVar26 = (bool)((byte)(uVar30 >> 1) & 1);
        local_a6c0._132_4_ = (uint)bVar26 * auVar59._4_4_ | (uint)!bVar26 * auVar62._4_4_;
        bVar26 = (bool)((byte)(uVar30 >> 2) & 1);
        local_a6c0._136_4_ = (uint)bVar26 * auVar59._8_4_ | (uint)!bVar26 * auVar62._8_4_;
        bVar26 = (bool)((byte)(uVar30 >> 3) & 1);
        local_a6c0._140_4_ = (uint)bVar26 * auVar59._12_4_ | (uint)!bVar26 * auVar62._12_4_;
        bVar26 = (bool)((byte)(uVar30 >> 4) & 1);
        local_a6c0._144_4_ = (uint)bVar26 * auVar59._16_4_ | (uint)!bVar26 * auVar62._16_4_;
        bVar26 = (bool)((byte)(uVar30 >> 5) & 1);
        local_a6c0._148_4_ = (uint)bVar26 * auVar59._20_4_ | (uint)!bVar26 * auVar62._20_4_;
        bVar26 = (bool)((byte)(uVar30 >> 6) & 1);
        local_a6c0._152_4_ = (uint)bVar26 * auVar59._24_4_ | (uint)!bVar26 * auVar62._24_4_;
        bVar26 = (bool)((byte)(uVar30 >> 7) & 1);
        local_a6c0._156_4_ = (uint)bVar26 * auVar59._28_4_ | (uint)!bVar26 * auVar62._28_4_;
        bVar26 = (bool)((byte)(uVar30 >> 8) & 1);
        local_a6c0._160_4_ = (uint)bVar26 * auVar59._32_4_ | (uint)!bVar26 * auVar62._32_4_;
        bVar26 = (bool)((byte)(uVar30 >> 9) & 1);
        local_a6c0._164_4_ = (uint)bVar26 * auVar59._36_4_ | (uint)!bVar26 * auVar62._36_4_;
        bVar26 = (bool)((byte)(uVar30 >> 10) & 1);
        local_a6c0._168_4_ = (uint)bVar26 * auVar59._40_4_ | (uint)!bVar26 * auVar62._40_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xb) & 1);
        local_a6c0._172_4_ = (uint)bVar26 * auVar59._44_4_ | (uint)!bVar26 * auVar62._44_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xc) & 1);
        local_a6c0._176_4_ = (uint)bVar26 * auVar59._48_4_ | (uint)!bVar26 * auVar62._48_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xd) & 1);
        local_a6c0._180_4_ = (uint)bVar26 * auVar59._52_4_ | (uint)!bVar26 * auVar62._52_4_;
        bVar26 = (bool)((byte)(uVar30 >> 0xe) & 1);
        local_a6c0._184_4_ = (uint)bVar26 * auVar59._56_4_ | (uint)!bVar26 * auVar62._56_4_;
        bVar26 = SUB81(uVar30 >> 0xf,0);
        local_a6c0._188_4_ = (uint)bVar26 * auVar59._60_4_ | (uint)!bVar26 * auVar62._60_4_;
        auVar58 = vmulps_avx512f(auVar48,(undefined1  [64])local_a6c0.field_0.z.field_0);
        auVar58 = vfmadd213ps_avx512f(auVar52,(undefined1  [64])local_a6c0.field_0.y.field_0,auVar58
                                     );
        auVar58 = vfmadd213ps_avx512f(auVar51,(undefined1  [64])local_a6c0.field_0.x.field_0,auVar58
                                     );
        auVar58 = vaddps_avx512f(auVar58,auVar58);
        auVar51 = vmulps_avx512f(auVar54,(undefined1  [64])local_a6c0.field_0.z.field_0);
        auVar51 = vfmadd213ps_avx512f(auVar53,(undefined1  [64])local_a6c0.field_0.y.field_0,auVar51
                                     );
        auVar51 = vfmadd213ps_avx512f(auVar49,(undefined1  [64])local_a6c0.field_0.x.field_0,auVar51
                                     );
        auVar52 = vrcp14ps_avx512f(auVar58);
        auVar51 = vaddps_avx512f(auVar51,auVar51);
        auVar48 = vfnmadd213ps_avx512f(auVar52,auVar58,auVar41);
        auVar52 = vfmadd132ps_avx512f(auVar48,auVar52,auVar52);
        local_a600 = vmulps_avx512f(auVar51,auVar52);
        uVar22 = vcmpps_avx512f(local_a600,*(undefined1 (*) [64])(ray + 0x200),2);
        uVar23 = vcmpps_avx512f(local_a600,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        uVar24 = vcmpps_avx512f(auVar58,_DAT_01fbd500,4);
        uVar36 = uVar36 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar24;
        if (uVar36 != 0) {
          pGVar1 = (context->scene->geometries).items[uVar38].ptr;
          auVar58 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
          uVar22 = vptestmd_avx512f(auVar58,*(undefined1 (*) [64])(ray + 0x240));
          uVar36 = uVar36 & (ushort)uVar22;
          if (uVar36 != 0) {
            local_a944 = *(undefined4 *)((long)&local_a810 + lVar35 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar87 = vrcp14ps_avx512f(auVar47);
              auVar40._8_4_ = 0x219392ef;
              auVar40._0_8_ = 0x219392ef219392ef;
              auVar40._12_4_ = 0x219392ef;
              auVar40._16_4_ = 0x219392ef;
              auVar40._20_4_ = 0x219392ef;
              auVar40._24_4_ = 0x219392ef;
              auVar40._28_4_ = 0x219392ef;
              auVar40._32_4_ = 0x219392ef;
              auVar40._36_4_ = 0x219392ef;
              auVar40._40_4_ = 0x219392ef;
              auVar40._44_4_ = 0x219392ef;
              auVar40._48_4_ = 0x219392ef;
              auVar40._52_4_ = 0x219392ef;
              auVar40._56_4_ = 0x219392ef;
              auVar40._60_4_ = 0x219392ef;
              uVar38 = vcmpps_avx512f(auVar50,auVar40,5);
              auVar40 = vfnmadd213ps_avx512f(auVar47,auVar87,auVar41);
              auVar40 = vfmadd132ps_avx512f(auVar40,auVar87,auVar87);
              auVar87._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar40._4_4_;
              auVar87._0_4_ = (uint)((byte)uVar38 & 1) * auVar40._0_4_;
              auVar87._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar40._8_4_;
              auVar87._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar40._12_4_;
              auVar87._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar40._16_4_;
              auVar87._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar40._20_4_;
              auVar87._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar40._24_4_;
              auVar87._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar40._28_4_;
              auVar87._32_4_ = (uint)((byte)(uVar38 >> 8) & 1) * auVar40._32_4_;
              auVar87._36_4_ = (uint)((byte)(uVar38 >> 9) & 1) * auVar40._36_4_;
              auVar87._40_4_ = (uint)((byte)(uVar38 >> 10) & 1) * auVar40._40_4_;
              auVar87._44_4_ = (uint)((byte)(uVar38 >> 0xb) & 1) * auVar40._44_4_;
              auVar87._48_4_ = (uint)((byte)(uVar38 >> 0xc) & 1) * auVar40._48_4_;
              auVar87._52_4_ = (uint)((byte)(uVar38 >> 0xd) & 1) * auVar40._52_4_;
              auVar87._56_4_ = (uint)((byte)(uVar38 >> 0xe) & 1) * auVar40._56_4_;
              auVar87._60_4_ = (uint)(byte)(uVar38 >> 0xf) * auVar40._60_4_;
              auVar40 = vmulps_avx512f(auVar65,auVar87);
              local_a580 = vminps_avx512f(auVar40,auVar41);
              auVar40 = vmulps_avx512f(auVar66,auVar87);
              local_a5c0 = vminps_avx512f(auVar40,auVar41);
              local_a900._8_8_ = (vfloat_impl<16> *)local_a780;
              local_a900._0_8_ = local_a480;
              _Stack_a8f0._M_head_impl = (vfloat_impl<16> *)local_a740;
              auStack_a8e0 = auVar46._32_32_;
              _Stack_a8e8._M_head_impl = (vfloat_impl<16> *)local_a700;
              local_a940 = pGVar1;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
              ::
              _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                          *)local_a900,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                          *)&local_a6c0.field_0);
              pRVar2 = context->user;
              auVar40 = vpbroadcastd_avx512f();
              auVar87 = vpbroadcastd_avx512f();
              local_a580 = vmovdqa64_avx512f(auVar87);
              local_a540 = vmovdqa64_avx512f(auVar40);
              auVar20 = vpcmpeqd_avx2(auVar40._0_32_,auVar40._0_32_);
              local_a938[3] = auVar20;
              local_a938[2] = auVar20;
              local_a938[1] = auVar20;
              *local_a938 = auVar20;
              local_a500 = vbroadcastss_avx512f(ZEXT416(pRVar2->instID[0]));
              local_a4c0 = vbroadcastss_avx512f(ZEXT416(pRVar2->instPrimID[0]));
              local_a880 = *(undefined1 (*) [64])(ray + 0x200);
              auVar40 = vblendmps_avx512f(local_a880,local_a780);
              bVar26 = (bool)((byte)uVar36 & 1);
              bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
              bVar11 = (byte)(uVar36 >> 8);
              bVar12 = (bool)(bVar11 >> 1 & 1);
              bVar13 = (bool)(bVar11 >> 2 & 1);
              bVar14 = (bool)(bVar11 >> 3 & 1);
              bVar15 = (bool)(bVar11 >> 4 & 1);
              bVar16 = (bool)(bVar11 >> 5 & 1);
              bVar17 = (bool)(bVar11 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * local_a4c0._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * local_a4c0._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * local_a4c0._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * local_a4c0._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * local_a4c0._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar8 * auVar40._20_4_ | (uint)!bVar8 * local_a4c0._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * local_a4c0._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar10 * auVar40._28_4_ | (uint)!bVar10 * local_a4c0._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar11 & 1) * auVar40._32_4_ |
                   (uint)!(bool)(bVar11 & 1) * local_a4c0._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar12 * auVar40._36_4_ | (uint)!bVar12 * local_a4c0._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar13 * auVar40._40_4_ | (uint)!bVar13 * local_a4c0._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar14 * auVar40._44_4_ | (uint)!bVar14 * local_a4c0._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar15 * auVar40._48_4_ | (uint)!bVar15 * local_a4c0._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar16 * auVar40._52_4_ | (uint)!bVar16 * local_a4c0._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar17 * auVar40._56_4_ | (uint)!bVar17 * local_a4c0._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar36 >> 0xf) * auVar40._60_4_ |
                   (uint)!(bool)(bVar11 >> 7) * local_a4c0._60_4_;
              auVar46 = vpmovm2d_avx512dq((ulong)uVar36);
              _local_a900 = vmovdqa64_avx512f(auVar46);
              local_a930.valid = (int *)local_a900;
              local_a930.geometryUserPtr = local_a940->userPtr;
              local_a930.context = context->user;
              local_a930.hit = (RTCHitN *)&local_a6c0;
              local_a930.N = 0x10;
              local_a930.ray = (RTCRayN *)ray;
              if (local_a940->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_a940->occlusionFilterN)(&local_a930);
                auVar46 = vmovdqa64_avx512f(_local_a900);
              }
              uVar22 = vptestmd_avx512f(auVar46,auVar46);
              if ((short)uVar22 == 0) {
                uVar38 = 0;
                auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
              }
              else {
                p_Var3 = context->args->filter;
                if (p_Var3 == (RTCFilterFunctionN)0x0) {
                  auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                }
                else {
                  auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((local_a940->field_8).field_0x2 & 0x40) != 0)) {
                    (*p_Var3)(&local_a930);
                    auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                    auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                    auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                    auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                    auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                    auVar46 = vmovdqa64_avx512f(_local_a900);
                  }
                }
                uVar38 = vptestmd_avx512f(auVar46,auVar46);
                auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar26 = (bool)((byte)uVar38 & 1);
                bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar38 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar38 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar38 >> 7) & 1);
                bVar12 = (bool)((byte)(uVar38 >> 8) & 1);
                bVar13 = (bool)((byte)(uVar38 >> 9) & 1);
                bVar14 = (bool)((byte)(uVar38 >> 10) & 1);
                bVar15 = (bool)((byte)(uVar38 >> 0xb) & 1);
                bVar16 = (bool)((byte)(uVar38 >> 0xc) & 1);
                bVar17 = (bool)((byte)(uVar38 >> 0xd) & 1);
                bVar18 = (bool)((byte)(uVar38 >> 0xe) & 1);
                bVar19 = SUB81(uVar38 >> 0xf,0);
                *(uint *)(local_a930.ray + 0x200) =
                     (uint)bVar26 * auVar46._0_4_ | (uint)!bVar26 * *(int *)(local_a930.ray + 0x200)
                ;
                *(uint *)(local_a930.ray + 0x204) =
                     (uint)bVar4 * auVar46._4_4_ | (uint)!bVar4 * *(int *)(local_a930.ray + 0x204);
                *(uint *)(local_a930.ray + 0x208) =
                     (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * *(int *)(local_a930.ray + 0x208);
                *(uint *)(local_a930.ray + 0x20c) =
                     (uint)bVar6 * auVar46._12_4_ | (uint)!bVar6 * *(int *)(local_a930.ray + 0x20c);
                *(uint *)(local_a930.ray + 0x210) =
                     (uint)bVar7 * auVar46._16_4_ | (uint)!bVar7 * *(int *)(local_a930.ray + 0x210);
                *(uint *)(local_a930.ray + 0x214) =
                     (uint)bVar8 * auVar46._20_4_ | (uint)!bVar8 * *(int *)(local_a930.ray + 0x214);
                *(uint *)(local_a930.ray + 0x218) =
                     (uint)bVar9 * auVar46._24_4_ | (uint)!bVar9 * *(int *)(local_a930.ray + 0x218);
                *(uint *)(local_a930.ray + 0x21c) =
                     (uint)bVar10 * auVar46._28_4_ |
                     (uint)!bVar10 * *(int *)(local_a930.ray + 0x21c);
                *(uint *)(local_a930.ray + 0x220) =
                     (uint)bVar12 * auVar46._32_4_ |
                     (uint)!bVar12 * *(int *)(local_a930.ray + 0x220);
                *(uint *)(local_a930.ray + 0x224) =
                     (uint)bVar13 * auVar46._36_4_ |
                     (uint)!bVar13 * *(int *)(local_a930.ray + 0x224);
                *(uint *)(local_a930.ray + 0x228) =
                     (uint)bVar14 * auVar46._40_4_ |
                     (uint)!bVar14 * *(int *)(local_a930.ray + 0x228);
                *(uint *)(local_a930.ray + 0x22c) =
                     (uint)bVar15 * auVar46._44_4_ |
                     (uint)!bVar15 * *(int *)(local_a930.ray + 0x22c);
                *(uint *)(local_a930.ray + 0x230) =
                     (uint)bVar16 * auVar46._48_4_ |
                     (uint)!bVar16 * *(int *)(local_a930.ray + 0x230);
                *(uint *)(local_a930.ray + 0x234) =
                     (uint)bVar17 * auVar46._52_4_ |
                     (uint)!bVar17 * *(int *)(local_a930.ray + 0x234);
                *(uint *)(local_a930.ray + 0x238) =
                     (uint)bVar18 * auVar46._56_4_ |
                     (uint)!bVar18 * *(int *)(local_a930.ray + 0x238);
                *(uint *)(local_a930.ray + 0x23c) =
                     (uint)bVar19 * auVar46._60_4_ |
                     (uint)!bVar19 * *(int *)(local_a930.ray + 0x23c);
              }
              uVar36 = (ushort)uVar38;
              bVar26 = (bool)((byte)uVar38 & 1);
              bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar38 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar38 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar38 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar38 >> 7) & 1);
              bVar12 = (bool)((byte)(uVar38 >> 8) & 1);
              bVar13 = (bool)((byte)(uVar38 >> 9) & 1);
              bVar14 = (bool)((byte)(uVar38 >> 10) & 1);
              bVar15 = (bool)((byte)(uVar38 >> 0xb) & 1);
              bVar16 = (bool)((byte)(uVar38 >> 0xc) & 1);
              bVar17 = (bool)((byte)(uVar38 >> 0xd) & 1);
              bVar18 = (bool)((byte)(uVar38 >> 0xe) & 1);
              bVar19 = SUB81(uVar38 >> 0xf,0);
              *(uint *)local_a950 =
                   (uint)bVar26 * *(int *)local_a950 | (uint)!bVar26 * local_a880._0_4_;
              *(uint *)(local_a950 + 4) =
                   (uint)bVar4 * *(int *)(local_a950 + 4) | (uint)!bVar4 * local_a880._4_4_;
              *(uint *)(local_a950 + 8) =
                   (uint)bVar5 * *(int *)(local_a950 + 8) | (uint)!bVar5 * local_a880._8_4_;
              *(uint *)(local_a950 + 0xc) =
                   (uint)bVar6 * *(int *)(local_a950 + 0xc) | (uint)!bVar6 * local_a880._12_4_;
              *(uint *)(local_a950 + 0x10) =
                   (uint)bVar7 * *(int *)(local_a950 + 0x10) | (uint)!bVar7 * local_a880._16_4_;
              *(uint *)(local_a950 + 0x14) =
                   (uint)bVar8 * *(int *)(local_a950 + 0x14) | (uint)!bVar8 * local_a880._20_4_;
              *(uint *)(local_a950 + 0x18) =
                   (uint)bVar9 * *(int *)(local_a950 + 0x18) | (uint)!bVar9 * local_a880._24_4_;
              *(uint *)(local_a950 + 0x1c) =
                   (uint)bVar10 * *(int *)(local_a950 + 0x1c) | (uint)!bVar10 * local_a880._28_4_;
              *(uint *)(local_a950 + 0x20) =
                   (uint)bVar12 * *(int *)(local_a950 + 0x20) | (uint)!bVar12 * local_a880._32_4_;
              *(uint *)(local_a950 + 0x24) =
                   (uint)bVar13 * *(int *)(local_a950 + 0x24) | (uint)!bVar13 * local_a880._36_4_;
              *(uint *)(local_a950 + 0x28) =
                   (uint)bVar14 * *(int *)(local_a950 + 0x28) | (uint)!bVar14 * local_a880._40_4_;
              *(uint *)(local_a950 + 0x2c) =
                   (uint)bVar15 * *(int *)(local_a950 + 0x2c) | (uint)!bVar15 * local_a880._44_4_;
              *(uint *)(local_a950 + 0x30) =
                   (uint)bVar16 * *(int *)(local_a950 + 0x30) | (uint)!bVar16 * local_a880._48_4_;
              *(uint *)(local_a950 + 0x34) =
                   (uint)bVar17 * *(int *)(local_a950 + 0x34) | (uint)!bVar17 * local_a880._52_4_;
              *(uint *)(local_a950 + 0x38) =
                   (uint)bVar18 * *(int *)(local_a950 + 0x38) | (uint)!bVar18 * local_a880._56_4_;
              *(uint *)(local_a950 + 0x3c) =
                   (uint)bVar19 * *(int *)(local_a950 + 0x3c) | (uint)!bVar19 * local_a880._60_4_;
            }
            uVar31 = uVar31 & (ushort)~uVar36;
          }
        }
      }
      auVar46 = _local_a900;
      if ((ushort)uVar31 == 0) break;
      auVar45 = *(undefined1 (*) [64])ray;
      auVar58 = *(undefined1 (*) [64])(ray + 0x40);
      auVar47 = *(undefined1 (*) [64])(ray + 0x80);
      auVar50 = *(undefined1 (*) [64])(ray + 0x100);
      auVar51 = *(undefined1 (*) [64])(ray + 0x140);
      auVar52 = *(undefined1 (*) [64])(ray + 0x180);
      auVar48 = vsubps_avx512f(local_9f00,auVar45);
      auVar49 = vsubps_avx512f(local_9f40,auVar58);
      auVar53 = vsubps_avx512f(local_9f80,auVar47);
      auVar54 = vsubps_avx512f(local_9fc0,auVar45);
      auVar55 = vsubps_avx512f(local_a000,auVar58);
      auVar56 = vsubps_avx512f(local_a040,auVar47);
      auVar57 = vsubps_avx512f(local_a7c0,auVar45);
      auVar58 = vsubps_avx512f(local_a800,auVar58);
      auVar47 = vsubps_avx512f(local_9ec0,auVar47);
      auVar59 = vsubps_avx512f(auVar57,auVar48);
      auVar60 = vsubps_avx512f(auVar58,auVar49);
      auVar61 = vsubps_avx512f(auVar47,auVar53);
      auVar62 = vsubps_avx512f(auVar48,auVar54);
      auVar63 = vsubps_avx512f(auVar49,auVar55);
      auVar64 = vsubps_avx512f(auVar53,auVar56);
      auVar65 = vsubps_avx512f(auVar54,auVar57);
      auVar66 = vsubps_avx512f(auVar55,auVar58);
      auVar67 = vsubps_avx512f(auVar56,auVar47);
      auVar45 = vaddps_avx512f(auVar57,auVar48);
      auVar68 = vaddps_avx512f(auVar58,auVar49);
      auVar69 = vaddps_avx512f(auVar47,auVar53);
      auVar70 = vmulps_avx512f(auVar68,auVar61);
      auVar70 = vfmsub231ps_avx512f(auVar70,auVar60,auVar69);
      auVar69 = vmulps_avx512f(auVar69,auVar59);
      auVar69 = vfmsub231ps_avx512f(auVar69,auVar61,auVar45);
      auVar45 = vmulps_avx512f(auVar45,auVar60);
      auVar45 = vfmsub231ps_avx512f(auVar45,auVar59,auVar68);
      auVar45 = vmulps_avx512f(auVar45,auVar52);
      auVar45 = vfmadd231ps_avx512f(auVar45,auVar51,auVar69);
      auVar68 = vfmadd231ps_avx512f(auVar45,auVar50,auVar70);
      auVar45 = vaddps_avx512f(auVar48,auVar54);
      auVar69 = vaddps_avx512f(auVar49,auVar55);
      auVar70 = vaddps_avx512f(auVar53,auVar56);
      auVar71 = vmulps_avx512f(auVar69,auVar64);
      auVar71 = vfmsub231ps_avx512f(auVar71,auVar63,auVar70);
      auVar70 = vmulps_avx512f(auVar70,auVar62);
      auVar70 = vfmsub231ps_avx512f(auVar70,auVar64,auVar45);
      auVar45 = vmulps_avx512f(auVar45,auVar63);
      auVar45 = vfmsub231ps_avx512f(auVar45,auVar62,auVar69);
      auVar45 = vmulps_avx512f(auVar45,auVar52);
      auVar45 = vfmadd231ps_avx512f(auVar45,auVar51,auVar70);
      auVar69 = vfmadd231ps_avx512f(auVar45,auVar50,auVar71);
      auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar54 = vaddps_avx512f(auVar54,auVar57);
      auVar58 = vaddps_avx512f(auVar55,auVar58);
      auVar47 = vaddps_avx512f(auVar56,auVar47);
      auVar55 = vmulps_avx512f(auVar58,auVar67);
      auVar55 = vfmsub231ps_avx512f(auVar55,auVar66,auVar47);
      auVar47 = vmulps_avx512f(auVar47,auVar65);
      auVar47 = vfmsub231ps_avx512f(auVar47,auVar67,auVar54);
      auVar54 = vmulps_avx512f(auVar54,auVar66);
      auVar58 = vfmsub231ps_avx512f(auVar54,auVar65,auVar58);
      auVar58 = vmulps_avx512f(auVar58,auVar52);
      auVar58 = vfmadd231ps_avx512f(auVar58,auVar51,auVar47);
      auVar58 = vfmadd231ps_avx512f(auVar58,auVar50,auVar55);
      auVar47 = vaddps_avx512f(auVar68,auVar69);
      auVar47 = vaddps_avx512f(auVar58,auVar47);
      auVar54 = vandps_avx512dq(auVar47,auVar40);
      auVar55 = vmulps_avx512f(auVar54,auVar44);
      auVar56 = vminps_avx512f(auVar68,auVar69);
      auVar56 = vminps_avx512f(auVar56,auVar58);
      auVar57 = vxorps_avx512dq(auVar55,auVar45);
      uVar22 = vcmpps_avx512f(auVar56,auVar57,5);
      auVar56 = vmaxps_avx512f(auVar68,auVar69);
      auVar58 = vmaxps_avx512f(auVar56,auVar58);
      uVar23 = vcmpps_avx512f(auVar58,auVar55,2);
      uVar36 = ((ushort)uVar22 | (ushort)uVar23) & (ushort)uVar31;
      if (uVar36 != 0) {
        auVar58 = vmulps_avx512f(auVar63,auVar61);
        auVar55 = vmulps_avx512f(auVar59,auVar64);
        auVar56 = vmulps_avx512f(auVar62,auVar60);
        auVar57 = vmulps_avx512f(auVar66,auVar64);
        auVar70 = vmulps_avx512f(auVar62,auVar67);
        auVar71 = vmulps_avx512f(auVar65,auVar63);
        auVar60 = vfmsub213ps_avx512f(auVar60,auVar64,auVar58);
        auVar61 = vfmsub213ps_avx512f(auVar61,auVar62,auVar55);
        auVar59 = vfmsub213ps_avx512f(auVar59,auVar63,auVar56);
        auVar63 = vfmsub213ps_avx512f(auVar67,auVar63,auVar57);
        auVar64 = vfmsub213ps_avx512f(auVar65,auVar64,auVar70);
        auVar62 = vfmsub213ps_avx512f(auVar66,auVar62,auVar71);
        auVar58 = vandps_avx512dq(auVar58,auVar40);
        auVar57 = vandps_avx512dq(auVar57,auVar40);
        uVar38 = vcmpps_avx512f(auVar58,auVar57,1);
        auVar58 = vandps_avx512dq(auVar55,auVar40);
        auVar55 = vandps_avx512dq(auVar70,auVar40);
        uVar25 = vcmpps_avx512f(auVar58,auVar55,1);
        auVar58 = vandps_avx512dq(auVar56,auVar40);
        auVar55 = vandps_avx512dq(auVar71,auVar40);
        uVar21 = vcmpps_avx512f(auVar58,auVar55,1);
        bVar26 = (bool)((byte)uVar38 & 1);
        local_a6c0._0_4_ = (uint)bVar26 * auVar60._0_4_ | (uint)!bVar26 * auVar63._0_4_;
        bVar26 = (bool)((byte)(uVar38 >> 1) & 1);
        local_a6c0._4_4_ = (uint)bVar26 * auVar60._4_4_ | (uint)!bVar26 * auVar63._4_4_;
        bVar26 = (bool)((byte)(uVar38 >> 2) & 1);
        local_a6c0._8_4_ = (uint)bVar26 * auVar60._8_4_ | (uint)!bVar26 * auVar63._8_4_;
        bVar26 = (bool)((byte)(uVar38 >> 3) & 1);
        local_a6c0._12_4_ = (uint)bVar26 * auVar60._12_4_ | (uint)!bVar26 * auVar63._12_4_;
        bVar26 = (bool)((byte)(uVar38 >> 4) & 1);
        local_a6c0._16_4_ = (uint)bVar26 * auVar60._16_4_ | (uint)!bVar26 * auVar63._16_4_;
        bVar26 = (bool)((byte)(uVar38 >> 5) & 1);
        local_a6c0._20_4_ = (uint)bVar26 * auVar60._20_4_ | (uint)!bVar26 * auVar63._20_4_;
        bVar26 = (bool)((byte)(uVar38 >> 6) & 1);
        local_a6c0._24_4_ = (uint)bVar26 * auVar60._24_4_ | (uint)!bVar26 * auVar63._24_4_;
        bVar26 = (bool)((byte)(uVar38 >> 7) & 1);
        local_a6c0._28_4_ = (uint)bVar26 * auVar60._28_4_ | (uint)!bVar26 * auVar63._28_4_;
        bVar26 = (bool)((byte)(uVar38 >> 8) & 1);
        local_a6c0._32_4_ = (uint)bVar26 * auVar60._32_4_ | (uint)!bVar26 * auVar63._32_4_;
        bVar26 = (bool)((byte)(uVar38 >> 9) & 1);
        local_a6c0._36_4_ = (uint)bVar26 * auVar60._36_4_ | (uint)!bVar26 * auVar63._36_4_;
        bVar26 = (bool)((byte)(uVar38 >> 10) & 1);
        local_a6c0._40_4_ = (uint)bVar26 * auVar60._40_4_ | (uint)!bVar26 * auVar63._40_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xb) & 1);
        local_a6c0._44_4_ = (uint)bVar26 * auVar60._44_4_ | (uint)!bVar26 * auVar63._44_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xc) & 1);
        local_a6c0._48_4_ = (uint)bVar26 * auVar60._48_4_ | (uint)!bVar26 * auVar63._48_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xd) & 1);
        local_a6c0._52_4_ = (uint)bVar26 * auVar60._52_4_ | (uint)!bVar26 * auVar63._52_4_;
        bVar26 = (bool)((byte)(uVar38 >> 0xe) & 1);
        local_a6c0._56_4_ = (uint)bVar26 * auVar60._56_4_ | (uint)!bVar26 * auVar63._56_4_;
        bVar26 = SUB81(uVar38 >> 0xf,0);
        local_a6c0._60_4_ = (uint)bVar26 * auVar60._60_4_ | (uint)!bVar26 * auVar63._60_4_;
        bVar26 = (bool)((byte)uVar25 & 1);
        local_a6c0._64_4_ = (uint)bVar26 * auVar61._0_4_ | (uint)!bVar26 * auVar64._0_4_;
        bVar26 = (bool)((byte)(uVar25 >> 1) & 1);
        local_a6c0._68_4_ = (uint)bVar26 * auVar61._4_4_ | (uint)!bVar26 * auVar64._4_4_;
        bVar26 = (bool)((byte)(uVar25 >> 2) & 1);
        local_a6c0._72_4_ = (uint)bVar26 * auVar61._8_4_ | (uint)!bVar26 * auVar64._8_4_;
        bVar26 = (bool)((byte)(uVar25 >> 3) & 1);
        local_a6c0._76_4_ = (uint)bVar26 * auVar61._12_4_ | (uint)!bVar26 * auVar64._12_4_;
        bVar26 = (bool)((byte)(uVar25 >> 4) & 1);
        local_a6c0._80_4_ = (uint)bVar26 * auVar61._16_4_ | (uint)!bVar26 * auVar64._16_4_;
        bVar26 = (bool)((byte)(uVar25 >> 5) & 1);
        local_a6c0._84_4_ = (uint)bVar26 * auVar61._20_4_ | (uint)!bVar26 * auVar64._20_4_;
        bVar26 = (bool)((byte)(uVar25 >> 6) & 1);
        local_a6c0._88_4_ = (uint)bVar26 * auVar61._24_4_ | (uint)!bVar26 * auVar64._24_4_;
        bVar26 = (bool)((byte)(uVar25 >> 7) & 1);
        local_a6c0._92_4_ = (uint)bVar26 * auVar61._28_4_ | (uint)!bVar26 * auVar64._28_4_;
        bVar26 = (bool)((byte)(uVar25 >> 8) & 1);
        local_a6c0._96_4_ = (uint)bVar26 * auVar61._32_4_ | (uint)!bVar26 * auVar64._32_4_;
        bVar26 = (bool)((byte)(uVar25 >> 9) & 1);
        local_a6c0._100_4_ = (uint)bVar26 * auVar61._36_4_ | (uint)!bVar26 * auVar64._36_4_;
        bVar26 = (bool)((byte)(uVar25 >> 10) & 1);
        local_a6c0._104_4_ = (uint)bVar26 * auVar61._40_4_ | (uint)!bVar26 * auVar64._40_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xb) & 1);
        local_a6c0._108_4_ = (uint)bVar26 * auVar61._44_4_ | (uint)!bVar26 * auVar64._44_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xc) & 1);
        local_a6c0._112_4_ = (uint)bVar26 * auVar61._48_4_ | (uint)!bVar26 * auVar64._48_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xd) & 1);
        local_a6c0._116_4_ = (uint)bVar26 * auVar61._52_4_ | (uint)!bVar26 * auVar64._52_4_;
        bVar26 = (bool)((byte)(uVar25 >> 0xe) & 1);
        local_a6c0._120_4_ = (uint)bVar26 * auVar61._56_4_ | (uint)!bVar26 * auVar64._56_4_;
        bVar26 = SUB81(uVar25 >> 0xf,0);
        local_a6c0._124_4_ = (uint)bVar26 * auVar61._60_4_ | (uint)!bVar26 * auVar64._60_4_;
        bVar26 = (bool)((byte)uVar21 & 1);
        local_a6c0._128_4_ = (uint)bVar26 * auVar59._0_4_ | (uint)!bVar26 * auVar62._0_4_;
        bVar26 = (bool)((byte)(uVar21 >> 1) & 1);
        local_a6c0._132_4_ = (uint)bVar26 * auVar59._4_4_ | (uint)!bVar26 * auVar62._4_4_;
        bVar26 = (bool)((byte)(uVar21 >> 2) & 1);
        local_a6c0._136_4_ = (uint)bVar26 * auVar59._8_4_ | (uint)!bVar26 * auVar62._8_4_;
        bVar26 = (bool)((byte)(uVar21 >> 3) & 1);
        local_a6c0._140_4_ = (uint)bVar26 * auVar59._12_4_ | (uint)!bVar26 * auVar62._12_4_;
        bVar26 = (bool)((byte)(uVar21 >> 4) & 1);
        local_a6c0._144_4_ = (uint)bVar26 * auVar59._16_4_ | (uint)!bVar26 * auVar62._16_4_;
        bVar26 = (bool)((byte)(uVar21 >> 5) & 1);
        local_a6c0._148_4_ = (uint)bVar26 * auVar59._20_4_ | (uint)!bVar26 * auVar62._20_4_;
        bVar26 = (bool)((byte)(uVar21 >> 6) & 1);
        local_a6c0._152_4_ = (uint)bVar26 * auVar59._24_4_ | (uint)!bVar26 * auVar62._24_4_;
        bVar26 = (bool)((byte)(uVar21 >> 7) & 1);
        local_a6c0._156_4_ = (uint)bVar26 * auVar59._28_4_ | (uint)!bVar26 * auVar62._28_4_;
        bVar26 = (bool)((byte)(uVar21 >> 8) & 1);
        local_a6c0._160_4_ = (uint)bVar26 * auVar59._32_4_ | (uint)!bVar26 * auVar62._32_4_;
        bVar26 = (bool)((byte)(uVar21 >> 9) & 1);
        local_a6c0._164_4_ = (uint)bVar26 * auVar59._36_4_ | (uint)!bVar26 * auVar62._36_4_;
        bVar26 = (bool)((byte)(uVar21 >> 10) & 1);
        local_a6c0._168_4_ = (uint)bVar26 * auVar59._40_4_ | (uint)!bVar26 * auVar62._40_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xb) & 1);
        local_a6c0._172_4_ = (uint)bVar26 * auVar59._44_4_ | (uint)!bVar26 * auVar62._44_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xc) & 1);
        local_a6c0._176_4_ = (uint)bVar26 * auVar59._48_4_ | (uint)!bVar26 * auVar62._48_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xd) & 1);
        local_a6c0._180_4_ = (uint)bVar26 * auVar59._52_4_ | (uint)!bVar26 * auVar62._52_4_;
        bVar26 = (bool)((byte)(uVar21 >> 0xe) & 1);
        local_a6c0._184_4_ = (uint)bVar26 * auVar59._56_4_ | (uint)!bVar26 * auVar62._56_4_;
        bVar26 = SUB81(uVar21 >> 0xf,0);
        local_a6c0._188_4_ = (uint)bVar26 * auVar59._60_4_ | (uint)!bVar26 * auVar62._60_4_;
        auVar58 = vmulps_avx512f(auVar52,(undefined1  [64])local_a6c0.field_0.z.field_0);
        auVar58 = vfmadd213ps_avx512f(auVar51,(undefined1  [64])local_a6c0.field_0.y.field_0,auVar58
                                     );
        auVar58 = vfmadd213ps_avx512f(auVar50,(undefined1  [64])local_a6c0.field_0.x.field_0,auVar58
                                     );
        auVar58 = vaddps_avx512f(auVar58,auVar58);
        auVar50 = vmulps_avx512f(auVar53,(undefined1  [64])local_a6c0.field_0.z.field_0);
        auVar50 = vfmadd213ps_avx512f(auVar49,(undefined1  [64])local_a6c0.field_0.y.field_0,auVar50
                                     );
        auVar50 = vfmadd213ps_avx512f(auVar48,(undefined1  [64])local_a6c0.field_0.x.field_0,auVar50
                                     );
        auVar51 = vrcp14ps_avx512f(auVar58);
        auVar50 = vaddps_avx512f(auVar50,auVar50);
        auVar52 = vfnmadd213ps_avx512f(auVar51,auVar58,auVar41);
        auVar51 = vfmadd132ps_avx512f(auVar52,auVar51,auVar51);
        local_a600 = vmulps_avx512f(auVar50,auVar51);
        uVar22 = vcmpps_avx512f(local_a600,*(undefined1 (*) [64])(ray + 0x200),2);
        uVar23 = vcmpps_avx512f(local_a600,*(undefined1 (*) [64])(ray + 0xc0),0xd);
        uVar24 = vcmpps_avx512f(auVar58,_DAT_01fbd500,4);
        uVar36 = uVar36 & (ushort)uVar22 & (ushort)uVar23 & (ushort)uVar24;
        if (uVar36 != 0) {
          uVar38 = CONCAT44(0,*(uint *)(lVar27 + lVar35 * 4));
          pGVar1 = (context->scene->geometries).items[uVar38].ptr;
          auVar58 = vpbroadcastd_avx512f(ZEXT416(pGVar1->mask));
          uVar22 = vptestmd_avx512f(auVar58,*(undefined1 (*) [64])(ray + 0x240));
          uVar36 = uVar36 & (ushort)uVar22;
          if (uVar36 != 0) {
            local_a880._0_8_ = uVar38;
            local_a7c0._0_4_ = *(undefined4 *)((long)&local_a810 + lVar35 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar1->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar42._8_4_ = 0x219392ef;
              auVar42._0_8_ = 0x219392ef219392ef;
              auVar42._12_4_ = 0x219392ef;
              auVar42._16_4_ = 0x219392ef;
              auVar42._20_4_ = 0x219392ef;
              auVar42._24_4_ = 0x219392ef;
              auVar42._28_4_ = 0x219392ef;
              auVar42._32_4_ = 0x219392ef;
              auVar42._36_4_ = 0x219392ef;
              auVar42._40_4_ = 0x219392ef;
              auVar42._44_4_ = 0x219392ef;
              auVar42._48_4_ = 0x219392ef;
              auVar42._52_4_ = 0x219392ef;
              auVar42._56_4_ = 0x219392ef;
              auVar42._60_4_ = 0x219392ef;
              uVar38 = vcmpps_avx512f(auVar54,auVar42,5);
              auVar40 = vrcp14ps_avx512f(auVar47);
              auVar87 = vfnmadd213ps_avx512f(auVar47,auVar40,auVar41);
              auVar40 = vfmadd132ps_avx512f(auVar87,auVar40,auVar40);
              auVar58._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar40._4_4_;
              auVar58._0_4_ = (uint)((byte)uVar38 & 1) * auVar40._0_4_;
              auVar58._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar40._8_4_;
              auVar58._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar40._12_4_;
              auVar58._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar40._16_4_;
              auVar58._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar40._20_4_;
              auVar58._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar40._24_4_;
              auVar58._28_4_ = (uint)((byte)(uVar38 >> 7) & 1) * auVar40._28_4_;
              auVar58._32_4_ = (uint)((byte)(uVar38 >> 8) & 1) * auVar40._32_4_;
              auVar58._36_4_ = (uint)((byte)(uVar38 >> 9) & 1) * auVar40._36_4_;
              auVar58._40_4_ = (uint)((byte)(uVar38 >> 10) & 1) * auVar40._40_4_;
              auVar58._44_4_ = (uint)((byte)(uVar38 >> 0xb) & 1) * auVar40._44_4_;
              auVar58._48_4_ = (uint)((byte)(uVar38 >> 0xc) & 1) * auVar40._48_4_;
              auVar58._52_4_ = (uint)((byte)(uVar38 >> 0xd) & 1) * auVar40._52_4_;
              auVar58._56_4_ = (uint)((byte)(uVar38 >> 0xe) & 1) * auVar40._56_4_;
              auVar58._60_4_ = (uint)(byte)(uVar38 >> 0xf) * auVar40._60_4_;
              auVar40 = vmulps_avx512f(auVar68,auVar58);
              auVar40 = vminps_avx512f(auVar40,auVar41);
              auVar87 = vmulps_avx512f(auVar69,auVar58);
              auVar87 = vminps_avx512f(auVar87,auVar41);
              local_a580 = vsubps_avx512f(auVar41,auVar40);
              local_a5c0 = vsubps_avx512f(auVar41,auVar87);
              local_a900._8_8_ = (vfloat_impl<16> *)local_a780;
              local_a900._0_8_ = local_a480;
              _Stack_a8f0._M_head_impl = (vfloat_impl<16> *)local_a740;
              auStack_a8e0 = auVar46._32_32_;
              _Stack_a8e8._M_head_impl = (vfloat_impl<16> *)local_a700;
              local_a800._0_8_ = pGVar1;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::vfloat_impl<16>&,embree::Vec3<embree::vfloat_impl<16>>&>
              ::
              _M_assign<embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::vfloat_impl<16>,embree::Vec3<embree::vfloat_impl<16>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::vfloat_impl<16>_&,_embree::Vec3<embree::vfloat_impl<16>_>_&>
                          *)local_a900,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::vfloat_impl<16>,_embree::Vec3<embree::vfloat_impl<16>_>_>
                          *)&local_a6c0.field_0);
              pRVar2 = context->user;
              auVar40 = vpbroadcastd_avx512f();
              auVar87 = vpbroadcastd_avx512f();
              local_a580 = vmovdqa64_avx512f(auVar87);
              local_a540 = vmovdqa64_avx512f(auVar40);
              auVar20 = vpcmpeqd_avx2(auVar40._0_32_,auVar40._0_32_);
              local_a938[3] = auVar20;
              local_a938[2] = auVar20;
              local_a938[1] = auVar20;
              *local_a938 = auVar20;
              local_a500 = vbroadcastss_avx512f(ZEXT416(pRVar2->instID[0]));
              local_a4c0 = vbroadcastss_avx512f(ZEXT416(pRVar2->instPrimID[0]));
              local_a880 = *(undefined1 (*) [64])(ray + 0x200);
              auVar40 = vblendmps_avx512f(local_a880,local_a780);
              bVar26 = (bool)((byte)uVar36 & 1);
              bVar4 = (bool)((byte)(uVar36 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar36 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar36 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar36 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar36 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar36 >> 7) & 1);
              bVar11 = (byte)(uVar36 >> 8);
              bVar12 = (bool)(bVar11 >> 1 & 1);
              bVar13 = (bool)(bVar11 >> 2 & 1);
              bVar14 = (bool)(bVar11 >> 3 & 1);
              bVar15 = (bool)(bVar11 >> 4 & 1);
              bVar16 = (bool)(bVar11 >> 5 & 1);
              bVar17 = (bool)(bVar11 >> 6 & 1);
              *(uint *)(ray + 0x200) =
                   (uint)bVar26 * auVar40._0_4_ | (uint)!bVar26 * local_a4c0._0_4_;
              *(uint *)(ray + 0x204) = (uint)bVar4 * auVar40._4_4_ | (uint)!bVar4 * local_a4c0._4_4_
              ;
              *(uint *)(ray + 0x208) = (uint)bVar5 * auVar40._8_4_ | (uint)!bVar5 * local_a4c0._8_4_
              ;
              *(uint *)(ray + 0x20c) =
                   (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * local_a4c0._12_4_;
              *(uint *)(ray + 0x210) =
                   (uint)bVar7 * auVar40._16_4_ | (uint)!bVar7 * local_a4c0._16_4_;
              *(uint *)(ray + 0x214) =
                   (uint)bVar8 * auVar40._20_4_ | (uint)!bVar8 * local_a4c0._20_4_;
              *(uint *)(ray + 0x218) =
                   (uint)bVar9 * auVar40._24_4_ | (uint)!bVar9 * local_a4c0._24_4_;
              *(uint *)(ray + 0x21c) =
                   (uint)bVar10 * auVar40._28_4_ | (uint)!bVar10 * local_a4c0._28_4_;
              *(uint *)(ray + 0x220) =
                   (uint)(bVar11 & 1) * auVar40._32_4_ |
                   (uint)!(bool)(bVar11 & 1) * local_a4c0._32_4_;
              *(uint *)(ray + 0x224) =
                   (uint)bVar12 * auVar40._36_4_ | (uint)!bVar12 * local_a4c0._36_4_;
              *(uint *)(ray + 0x228) =
                   (uint)bVar13 * auVar40._40_4_ | (uint)!bVar13 * local_a4c0._40_4_;
              *(uint *)(ray + 0x22c) =
                   (uint)bVar14 * auVar40._44_4_ | (uint)!bVar14 * local_a4c0._44_4_;
              *(uint *)(ray + 0x230) =
                   (uint)bVar15 * auVar40._48_4_ | (uint)!bVar15 * local_a4c0._48_4_;
              *(uint *)(ray + 0x234) =
                   (uint)bVar16 * auVar40._52_4_ | (uint)!bVar16 * local_a4c0._52_4_;
              *(uint *)(ray + 0x238) =
                   (uint)bVar17 * auVar40._56_4_ | (uint)!bVar17 * local_a4c0._56_4_;
              *(uint *)(ray + 0x23c) =
                   (uint)(uVar36 >> 0xf) * auVar40._60_4_ |
                   (uint)!(bool)(bVar11 >> 7) * local_a4c0._60_4_;
              auVar46 = vpmovm2d_avx512dq((ulong)uVar36);
              _local_a900 = vmovdqa64_avx512f(auVar46);
              local_a930.valid = (int *)local_a900;
              local_a930.geometryUserPtr = *(void **)(local_a800._0_8_ + 0x18);
              local_a930.context = context->user;
              local_a930.hit = (RTCHitN *)&local_a6c0;
              local_a930.N = 0x10;
              local_a930.ray = (RTCRayN *)ray;
              if (*(code **)(local_a800._0_8_ + 0x48) != (code *)0x0) {
                (**(code **)(local_a800._0_8_ + 0x48))(&local_a930);
                auVar46 = vmovdqa64_avx512f(_local_a900);
              }
              uVar22 = vptestmd_avx512f(auVar46,auVar46);
              if ((short)uVar22 == 0) {
                uVar38 = 0;
                auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
              }
              else {
                p_Var3 = context->args->filter;
                if (p_Var3 == (RTCFilterFunctionN)0x0) {
                  auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                }
                else {
                  auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                  auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                  auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                  auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                  auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                  auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                  auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     ((*(byte *)(local_a800._0_8_ + 0x3e) & 0x40) != 0)) {
                    (*p_Var3)(&local_a930);
                    auVar45 = vbroadcastss_avx512f(ZEXT416(0x80000000));
                    auVar44 = vbroadcastss_avx512f(ZEXT416(0x34000000));
                    auVar43 = vbroadcastss_avx512f(ZEXT416(0x3f800003));
                    auVar87 = vbroadcastss_avx512f(ZEXT416(0x3f7ffffa));
                    auVar42 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                    auVar41 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                    auVar40 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
                    auVar46 = vmovdqa64_avx512f(_local_a900);
                  }
                }
                uVar38 = vptestmd_avx512f(auVar46,auVar46);
                auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar26 = (bool)((byte)uVar38 & 1);
                bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
                bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
                bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
                bVar7 = (bool)((byte)(uVar38 >> 4) & 1);
                bVar8 = (bool)((byte)(uVar38 >> 5) & 1);
                bVar9 = (bool)((byte)(uVar38 >> 6) & 1);
                bVar10 = (bool)((byte)(uVar38 >> 7) & 1);
                bVar12 = (bool)((byte)(uVar38 >> 8) & 1);
                bVar13 = (bool)((byte)(uVar38 >> 9) & 1);
                bVar14 = (bool)((byte)(uVar38 >> 10) & 1);
                bVar15 = (bool)((byte)(uVar38 >> 0xb) & 1);
                bVar16 = (bool)((byte)(uVar38 >> 0xc) & 1);
                bVar17 = (bool)((byte)(uVar38 >> 0xd) & 1);
                bVar18 = (bool)((byte)(uVar38 >> 0xe) & 1);
                bVar19 = SUB81(uVar38 >> 0xf,0);
                *(uint *)(local_a930.ray + 0x200) =
                     (uint)bVar26 * auVar46._0_4_ | (uint)!bVar26 * *(int *)(local_a930.ray + 0x200)
                ;
                *(uint *)(local_a930.ray + 0x204) =
                     (uint)bVar4 * auVar46._4_4_ | (uint)!bVar4 * *(int *)(local_a930.ray + 0x204);
                *(uint *)(local_a930.ray + 0x208) =
                     (uint)bVar5 * auVar46._8_4_ | (uint)!bVar5 * *(int *)(local_a930.ray + 0x208);
                *(uint *)(local_a930.ray + 0x20c) =
                     (uint)bVar6 * auVar46._12_4_ | (uint)!bVar6 * *(int *)(local_a930.ray + 0x20c);
                *(uint *)(local_a930.ray + 0x210) =
                     (uint)bVar7 * auVar46._16_4_ | (uint)!bVar7 * *(int *)(local_a930.ray + 0x210);
                *(uint *)(local_a930.ray + 0x214) =
                     (uint)bVar8 * auVar46._20_4_ | (uint)!bVar8 * *(int *)(local_a930.ray + 0x214);
                *(uint *)(local_a930.ray + 0x218) =
                     (uint)bVar9 * auVar46._24_4_ | (uint)!bVar9 * *(int *)(local_a930.ray + 0x218);
                *(uint *)(local_a930.ray + 0x21c) =
                     (uint)bVar10 * auVar46._28_4_ |
                     (uint)!bVar10 * *(int *)(local_a930.ray + 0x21c);
                *(uint *)(local_a930.ray + 0x220) =
                     (uint)bVar12 * auVar46._32_4_ |
                     (uint)!bVar12 * *(int *)(local_a930.ray + 0x220);
                *(uint *)(local_a930.ray + 0x224) =
                     (uint)bVar13 * auVar46._36_4_ |
                     (uint)!bVar13 * *(int *)(local_a930.ray + 0x224);
                *(uint *)(local_a930.ray + 0x228) =
                     (uint)bVar14 * auVar46._40_4_ |
                     (uint)!bVar14 * *(int *)(local_a930.ray + 0x228);
                *(uint *)(local_a930.ray + 0x22c) =
                     (uint)bVar15 * auVar46._44_4_ |
                     (uint)!bVar15 * *(int *)(local_a930.ray + 0x22c);
                *(uint *)(local_a930.ray + 0x230) =
                     (uint)bVar16 * auVar46._48_4_ |
                     (uint)!bVar16 * *(int *)(local_a930.ray + 0x230);
                *(uint *)(local_a930.ray + 0x234) =
                     (uint)bVar17 * auVar46._52_4_ |
                     (uint)!bVar17 * *(int *)(local_a930.ray + 0x234);
                *(uint *)(local_a930.ray + 0x238) =
                     (uint)bVar18 * auVar46._56_4_ |
                     (uint)!bVar18 * *(int *)(local_a930.ray + 0x238);
                *(uint *)(local_a930.ray + 0x23c) =
                     (uint)bVar19 * auVar46._60_4_ |
                     (uint)!bVar19 * *(int *)(local_a930.ray + 0x23c);
              }
              uVar36 = (ushort)uVar38;
              bVar26 = (bool)((byte)uVar38 & 1);
              bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
              bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
              bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
              bVar7 = (bool)((byte)(uVar38 >> 4) & 1);
              bVar8 = (bool)((byte)(uVar38 >> 5) & 1);
              bVar9 = (bool)((byte)(uVar38 >> 6) & 1);
              bVar10 = (bool)((byte)(uVar38 >> 7) & 1);
              bVar12 = (bool)((byte)(uVar38 >> 8) & 1);
              bVar13 = (bool)((byte)(uVar38 >> 9) & 1);
              bVar14 = (bool)((byte)(uVar38 >> 10) & 1);
              bVar15 = (bool)((byte)(uVar38 >> 0xb) & 1);
              bVar16 = (bool)((byte)(uVar38 >> 0xc) & 1);
              bVar17 = (bool)((byte)(uVar38 >> 0xd) & 1);
              bVar18 = (bool)((byte)(uVar38 >> 0xe) & 1);
              bVar19 = SUB81(uVar38 >> 0xf,0);
              *(uint *)local_a950 =
                   (uint)bVar26 * *(int *)local_a950 | (uint)!bVar26 * local_a880._0_4_;
              *(uint *)(local_a950 + 4) =
                   (uint)bVar4 * *(int *)(local_a950 + 4) | (uint)!bVar4 * local_a880._4_4_;
              *(uint *)(local_a950 + 8) =
                   (uint)bVar5 * *(int *)(local_a950 + 8) | (uint)!bVar5 * local_a880._8_4_;
              *(uint *)(local_a950 + 0xc) =
                   (uint)bVar6 * *(int *)(local_a950 + 0xc) | (uint)!bVar6 * local_a880._12_4_;
              *(uint *)(local_a950 + 0x10) =
                   (uint)bVar7 * *(int *)(local_a950 + 0x10) | (uint)!bVar7 * local_a880._16_4_;
              *(uint *)(local_a950 + 0x14) =
                   (uint)bVar8 * *(int *)(local_a950 + 0x14) | (uint)!bVar8 * local_a880._20_4_;
              *(uint *)(local_a950 + 0x18) =
                   (uint)bVar9 * *(int *)(local_a950 + 0x18) | (uint)!bVar9 * local_a880._24_4_;
              *(uint *)(local_a950 + 0x1c) =
                   (uint)bVar10 * *(int *)(local_a950 + 0x1c) | (uint)!bVar10 * local_a880._28_4_;
              *(uint *)(local_a950 + 0x20) =
                   (uint)bVar12 * *(int *)(local_a950 + 0x20) | (uint)!bVar12 * local_a880._32_4_;
              *(uint *)(local_a950 + 0x24) =
                   (uint)bVar13 * *(int *)(local_a950 + 0x24) | (uint)!bVar13 * local_a880._36_4_;
              *(uint *)(local_a950 + 0x28) =
                   (uint)bVar14 * *(int *)(local_a950 + 0x28) | (uint)!bVar14 * local_a880._40_4_;
              *(uint *)(local_a950 + 0x2c) =
                   (uint)bVar15 * *(int *)(local_a950 + 0x2c) | (uint)!bVar15 * local_a880._44_4_;
              *(uint *)(local_a950 + 0x30) =
                   (uint)bVar16 * *(int *)(local_a950 + 0x30) | (uint)!bVar16 * local_a880._48_4_;
              *(uint *)(local_a950 + 0x34) =
                   (uint)bVar17 * *(int *)(local_a950 + 0x34) | (uint)!bVar17 * local_a880._52_4_;
              *(uint *)(local_a950 + 0x38) =
                   (uint)bVar18 * *(int *)(local_a950 + 0x38) | (uint)!bVar18 * local_a880._56_4_;
              *(uint *)(local_a950 + 0x3c) =
                   (uint)bVar19 * *(int *)(local_a950 + 0x3c) | (uint)!bVar19 * local_a880._60_4_;
            }
            uVar31 = uVar31 & (ushort)~uVar36;
          }
        }
      }
      lVar35 = lVar35 + 1;
    } while ((short)uVar31 != 0);
    uVar36 = 0;
LAB_01e45b2a:
    lVar32 = local_a890 + 1;
    lVar27 = lVar27 + 0xe0;
    uVar36 = uVar36 & (ushort)uVar29;
    uVar29 = (uint)uVar36;
  } while (uVar36 != 0);
  uVar29 = 0;
LAB_01e45b4a:
  local_a97c = local_a97c | ~uVar29;
  if ((short)local_a97c == -1) {
    local_a97c = 0xffff;
    goto LAB_01e45c99;
  }
  auVar46 = vbroadcastss_avx512f(ZEXT416(0xff800000));
  bVar26 = (bool)((byte)local_a97c & 1);
  bVar4 = (bool)((byte)(local_a97c >> 1) & 1);
  bVar5 = (bool)((byte)(local_a97c >> 2) & 1);
  bVar6 = (bool)((byte)(local_a97c >> 3) & 1);
  bVar7 = (bool)((byte)(local_a97c >> 4) & 1);
  bVar8 = (bool)((byte)(local_a97c >> 5) & 1);
  bVar9 = (bool)((byte)(local_a97c >> 6) & 1);
  bVar10 = (bool)((byte)(local_a97c >> 7) & 1);
  bVar12 = (bool)((byte)(local_a97c >> 8) & 1);
  bVar13 = (bool)((byte)(local_a97c >> 9) & 1);
  bVar14 = (bool)((byte)(local_a97c >> 10) & 1);
  bVar15 = (bool)((byte)(local_a97c >> 0xb) & 1);
  bVar16 = (bool)((byte)(local_a97c >> 0xc) & 1);
  bVar17 = (bool)((byte)(local_a97c >> 0xd) & 1);
  bVar18 = (bool)((byte)(local_a97c >> 0xe) & 1);
  bVar19 = (bool)((byte)(local_a97c >> 0xf) & 1);
  local_a080 = (uint)bVar26 * auVar46._0_4_ | !bVar26 * local_a080;
  uStack_a07c = (uint)bVar4 * auVar46._4_4_ | !bVar4 * uStack_a07c;
  uStack_a078 = (uint)bVar5 * auVar46._8_4_ | !bVar5 * uStack_a078;
  uStack_a074 = (uint)bVar6 * auVar46._12_4_ | !bVar6 * uStack_a074;
  uStack_a070 = (uint)bVar7 * auVar46._16_4_ | !bVar7 * uStack_a070;
  uStack_a06c = (uint)bVar8 * auVar46._20_4_ | !bVar8 * uStack_a06c;
  uStack_a068 = (uint)bVar9 * auVar46._24_4_ | !bVar9 * uStack_a068;
  uStack_a064 = (uint)bVar10 * auVar46._28_4_ | !bVar10 * uStack_a064;
  uStack_a060 = (uint)bVar12 * auVar46._32_4_ | !bVar12 * uStack_a060;
  uStack_a05c = (uint)bVar13 * auVar46._36_4_ | !bVar13 * uStack_a05c;
  uStack_a058 = (uint)bVar14 * auVar46._40_4_ | !bVar14 * uStack_a058;
  uStack_a054 = (uint)bVar15 * auVar46._44_4_ | !bVar15 * uStack_a054;
  uStack_a050 = (uint)bVar16 * auVar46._48_4_ | !bVar16 * uStack_a050;
  uStack_a04c = (uint)bVar17 * auVar46._52_4_ | !bVar17 * uStack_a04c;
  uStack_a048 = (uint)bVar18 * auVar46._56_4_ | !bVar18 * uStack_a048;
  uStack_a044 = (uint)bVar19 * auVar46._60_4_ | !bVar19 * uStack_a044;
  goto LAB_01e447e2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }